

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>::
occluded(BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>
         *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  undefined8 *puVar15;
  float *pfVar16;
  float *pfVar17;
  ulong uVar18;
  Collider CVar19;
  ushort uVar20;
  ushort uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  code *pcVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  AABBNodeMB4D *node1;
  ulong uVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  uint uVar42;
  undefined4 uVar43;
  ulong uVar44;
  long lVar45;
  undefined8 uVar46;
  long lVar47;
  byte *pbVar48;
  ulong uVar49;
  ulong *puVar50;
  ulong uVar51;
  ulong uVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  byte bVar56;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  uint uVar86;
  uint uVar87;
  vint4 ai;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar88;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar89;
  uint uVar95;
  uint uVar96;
  vint4 ai_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar98;
  uint uVar104;
  uint uVar105;
  vint4 bi;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar106;
  float fVar115;
  vint4 ai_5;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar117;
  float fVar118;
  float fVar124;
  float fVar125;
  vint4 ai_1;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  uint uVar128;
  float fVar132;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar129 [16];
  uint uVar133;
  uint uVar135;
  uint uVar136;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar137;
  float fVar138;
  float fVar144;
  float fVar146;
  vint4 ai_7;
  undefined1 auVar139 [16];
  float fVar145;
  float fVar147;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar148;
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar154 [16];
  float fVar160;
  float fVar164;
  float fVar168;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar170;
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  vint4 bi_5;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  vint4 bi_2;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar188;
  float fVar190;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar191;
  undefined1 auVar187 [16];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_ca9;
  undefined8 local_ca8;
  float fStack_ca0;
  float fStack_c9c;
  undefined4 local_c98;
  undefined4 uStack_c94;
  float fStack_c90;
  float fStack_c8c;
  undefined8 local_c88;
  float fStack_c80;
  float fStack_c7c;
  int local_c74;
  ulong local_c70;
  ulong local_c68;
  Intersectors *local_c60;
  ulong *local_c58;
  long local_c50;
  undefined1 local_c48 [8];
  float fStack_c40;
  float fStack_c3c;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  Ray *local_c28;
  ulong local_c20;
  undefined8 local_c18;
  float fStack_c10;
  float fStack_c0c;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined4 local_c00;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  undefined4 local_be8;
  int *local_bd8;
  undefined8 local_bd0;
  undefined4 *local_bc8;
  Intersectors *local_bc0;
  undefined4 *local_bb8;
  undefined4 local_bb0;
  undefined1 local_ba8 [8];
  float fStack_ba0;
  float fStack_b9c;
  undefined8 local_b98;
  undefined8 uStack_b90;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  undefined8 local_b78;
  float fStack_b70;
  float fStack_b6c;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  ulong local_b58;
  long local_b50;
  long local_b48;
  long local_b40;
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  undefined1 local_b08 [8];
  float fStack_b00;
  float fStack_afc;
  undefined1 local_af8 [8];
  float fStack_af0;
  float fStack_aec;
  undefined1 local_ae8 [8];
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  long local_ac8;
  long local_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  undefined1 local_aa8 [8];
  float fStack_aa0;
  float fStack_a9c;
  undefined1 local_a98 [16];
  undefined1 *local_a88;
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [8];
  float fStack_a40;
  float fStack_a3c;
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  uint local_908;
  uint uStack_904;
  uint uStack_900;
  uint uStack_8fc;
  undefined1 local_8f8 [16];
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 local_8a8;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_858 [16];
  undefined8 local_848;
  undefined8 uStack_840;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  ulong local_7d8 [245];
  undefined1 auVar171 [12];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (fVar57 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar57)) {
    puVar50 = local_7d8 + 1;
    local_7d8[0] = *(ulong *)(*(long *)this + 0x70);
    uVar43 = *(undefined4 *)&This->ptr;
    fVar166 = *(float *)((long)&This->ptr + 4);
    fVar115 = *(float *)&This->leafIntersector;
    fVar116 = *(float *)((long)&This->leafIntersector + 4);
    CVar19 = This->collider;
    auVar185._4_4_ = -(uint)(ABS(CVar19.collide._4_4_) < 1e-18);
    auVar185._0_4_ = -(uint)(ABS(CVar19.collide._0_4_) < 1e-18);
    auVar185._8_4_ = -(uint)(ABS(CVar19.name._0_4_) < 1e-18);
    auVar185._12_4_ = -(uint)(ABS(CVar19.name._4_4_) < 1e-18);
    fVar117 = 0.0;
    if (0.0 <= fVar116) {
      fVar117 = fVar116;
    }
    auVar184 = divps(_DAT_01f46a60,(undefined1  [16])CVar19);
    auVar185 = blendvps(auVar184,_DAT_01f76a70,auVar185);
    fVar126 = auVar185._0_4_ * 0.99999964;
    fVar132 = auVar185._4_4_ * 0.99999964;
    fVar134 = auVar185._8_4_ * 0.99999964;
    fVar182 = auVar185._0_4_ * 1.0000004;
    fVar188 = auVar185._4_4_ * 1.0000004;
    local_888 = auVar185._8_4_ * 1.0000004;
    auVar184._4_4_ = uVar43;
    auVar184._0_4_ = uVar43;
    auVar184._8_4_ = uVar43;
    auVar184._12_4_ = uVar43;
    uVar44 = (ulong)(fVar126 < 0.0) << 4;
    uVar51 = (ulong)(fVar132 < 0.0) << 4 | 0x20;
    uVar49 = (ulong)(fVar134 < 0.0) << 4 | 0x40;
    uVar52 = uVar44 ^ 0x10;
    auVar177._4_4_ = fVar57;
    auVar177._0_4_ = fVar57;
    auVar177._8_4_ = fVar57;
    auVar177._12_4_ = fVar57;
    _local_908 = mm_lookupmask_ps._240_8_;
    _uStack_900 = mm_lookupmask_ps._248_8_;
    local_c60 = This;
    local_c28 = ray;
    local_858 = auVar177;
    local_868 = fVar115;
    fStack_864 = fVar115;
    fStack_860 = fVar115;
    fStack_85c = fVar115;
    local_878 = fVar117;
    fStack_874 = fVar117;
    fStack_870 = fVar117;
    fStack_86c = fVar117;
    fStack_884 = local_888;
    fStack_880 = local_888;
    fStack_87c = local_888;
    local_958 = fVar134;
    fStack_954 = fVar134;
    fStack_950 = fVar134;
    fStack_94c = fVar134;
    local_8f8 = auVar184;
    local_968 = fVar166;
    fStack_964 = fVar166;
    fStack_960 = fVar166;
    fStack_95c = fVar166;
    local_c68 = uVar44;
    local_918 = fVar126;
    fStack_914 = fVar126;
    fStack_910 = fVar126;
    fStack_90c = fVar126;
    local_928 = fVar132;
    fStack_924 = fVar132;
    fStack_920 = fVar132;
    fStack_91c = fVar132;
    local_938 = fVar182;
    fStack_934 = fVar182;
    fStack_930 = fVar182;
    fStack_92c = fVar182;
    local_948 = fVar188;
    fStack_944 = fVar188;
    fStack_940 = fVar188;
    fStack_93c = fVar188;
    fVar57 = fVar117;
    fVar116 = fVar117;
    fVar118 = fVar117;
    fVar168 = fVar132;
    fVar73 = fVar132;
    fVar127 = fVar132;
    fVar148 = fVar182;
    fVar149 = fVar182;
    fVar170 = fVar182;
    fVar150 = fVar188;
    fVar157 = fVar188;
    fVar161 = fVar188;
    fVar137 = fVar126;
    fVar144 = fVar126;
    fVar146 = fVar126;
    fVar165 = fVar134;
    fVar124 = fVar134;
    fVar125 = fVar134;
    fVar138 = fVar166;
    fVar145 = fVar166;
    fVar147 = fVar166;
    fVar181 = fVar115;
    fVar183 = fVar115;
    fVar189 = fVar115;
    fVar190 = local_888;
    fVar191 = local_888;
LAB_006b605d:
    if (puVar50 != local_7d8) {
      uVar41 = puVar50[-1];
      puVar50 = puVar50 + -1;
      do {
        fVar151 = *(float *)((long)&(This->collider).name + 4);
        do {
          if ((uVar41 & 8) != 0) {
            uVar38 = uVar41 & 0xfffffffffffffff0;
            local_c50 = 0;
            local_c58 = puVar50;
            local_ac8 = (ulong)((uint)uVar41 & 0xf) - 8;
            goto LAB_006b61fb;
          }
          uVar38 = uVar41 & 0xfffffffffffffff0;
          pfVar17 = (float *)(uVar38 + 0x80 + uVar44);
          pfVar16 = (float *)(uVar38 + 0x20 + uVar44);
          auVar90._0_4_ = ((*pfVar17 * fVar151 + *pfVar16) - auVar184._0_4_) * fVar126;
          auVar90._4_4_ = ((pfVar17[1] * fVar151 + pfVar16[1]) - auVar184._4_4_) * fVar137;
          auVar90._8_4_ = ((pfVar17[2] * fVar151 + pfVar16[2]) - auVar184._8_4_) * fVar144;
          auVar90._12_4_ = ((pfVar17[3] * fVar151 + pfVar16[3]) - auVar184._12_4_) * fVar146;
          pfVar17 = (float *)(uVar38 + 0x80 + uVar51);
          pfVar16 = (float *)(uVar38 + 0x20 + uVar51);
          auVar99._0_4_ = ((*pfVar17 * fVar151 + *pfVar16) - fVar166) * fVar132;
          auVar99._4_4_ = ((pfVar17[1] * fVar151 + pfVar16[1]) - fVar138) * fVar168;
          auVar99._8_4_ = ((pfVar17[2] * fVar151 + pfVar16[2]) - fVar145) * fVar73;
          auVar99._12_4_ = ((pfVar17[3] * fVar151 + pfVar16[3]) - fVar147) * fVar127;
          pfVar17 = (float *)(uVar38 + 0x80 + uVar49);
          pfVar16 = (float *)(uVar38 + 0x20 + uVar49);
          auVar74._0_4_ = ((*pfVar17 * fVar151 + *pfVar16) - fVar115) * fVar134;
          auVar74._4_4_ = ((pfVar17[1] * fVar151 + pfVar16[1]) - fVar181) * fVar165;
          auVar74._8_4_ = ((pfVar17[2] * fVar151 + pfVar16[2]) - fVar183) * fVar124;
          auVar74._12_4_ = ((pfVar17[3] * fVar151 + pfVar16[3]) - fVar189) * fVar125;
          auVar100 = maxps(auVar99,auVar74);
          auVar75._4_4_ = fVar57;
          auVar75._0_4_ = fVar117;
          auVar75._8_4_ = fVar116;
          auVar75._12_4_ = fVar118;
          auVar185 = maxps(auVar75,auVar90);
          auVar185 = maxps(auVar185,auVar100);
          pfVar17 = (float *)(uVar38 + 0x80 + uVar52);
          pfVar16 = (float *)(uVar38 + 0x20 + uVar52);
          auVar101._0_4_ = ((*pfVar17 * fVar151 + *pfVar16) - auVar184._0_4_) * fVar182;
          auVar101._4_4_ = ((pfVar17[1] * fVar151 + pfVar16[1]) - auVar184._4_4_) * fVar148;
          auVar101._8_4_ = ((pfVar17[2] * fVar151 + pfVar16[2]) - auVar184._8_4_) * fVar149;
          auVar101._12_4_ = ((pfVar17[3] * fVar151 + pfVar16[3]) - auVar184._12_4_) * fVar170;
          pfVar17 = (float *)(uVar38 + 0x80 + (uVar51 ^ 0x10));
          pfVar16 = (float *)(uVar38 + 0x20 + (uVar51 ^ 0x10));
          auVar107._0_4_ = ((*pfVar17 * fVar151 + *pfVar16) - fVar166) * fVar188;
          auVar107._4_4_ = ((pfVar17[1] * fVar151 + pfVar16[1]) - fVar138) * fVar150;
          auVar107._8_4_ = ((pfVar17[2] * fVar151 + pfVar16[2]) - fVar145) * fVar157;
          auVar107._12_4_ = ((pfVar17[3] * fVar151 + pfVar16[3]) - fVar147) * fVar161;
          pfVar17 = (float *)(uVar38 + 0x80 + (uVar49 ^ 0x10));
          pfVar16 = (float *)(uVar38 + 0x20 + (uVar49 ^ 0x10));
          auVar91._0_4_ = ((*pfVar17 * fVar151 + *pfVar16) - fVar115) * local_888;
          auVar91._4_4_ = ((pfVar17[1] * fVar151 + pfVar16[1]) - fVar181) * fStack_884;
          auVar91._8_4_ = ((pfVar17[2] * fVar151 + pfVar16[2]) - fVar183) * fVar190;
          auVar91._12_4_ = ((pfVar17[3] * fVar151 + pfVar16[3]) - fVar189) * fVar191;
          auVar108 = minps(auVar107,auVar91);
          auVar100 = minps(auVar177,auVar101);
          auVar100 = minps(auVar100,auVar108);
          bVar26 = auVar185._0_4_ <= auVar100._0_4_;
          bVar27 = auVar185._4_4_ <= auVar100._4_4_;
          bVar28 = auVar185._8_4_ <= auVar100._8_4_;
          bVar29 = auVar185._12_4_ <= auVar100._12_4_;
          if (((uint)uVar41 & 7) == 6) {
            bVar26 = (fVar151 < *(float *)(uVar38 + 0xf0) && *(float *)(uVar38 + 0xe0) <= fVar151)
                     && bVar26;
            bVar27 = (fVar151 < *(float *)(uVar38 + 0xf4) && *(float *)(uVar38 + 0xe4) <= fVar151)
                     && bVar27;
            bVar28 = (fVar151 < *(float *)(uVar38 + 0xf8) && *(float *)(uVar38 + 0xe8) <= fVar151)
                     && bVar28;
            bVar29 = (fVar151 < *(float *)(uVar38 + 0xfc) && *(float *)(uVar38 + 0xec) <= fVar151)
                     && bVar29;
          }
          auVar76._0_4_ = (uint)bVar26 * -0x80000000;
          auVar76._4_4_ = (uint)bVar27 * -0x80000000;
          auVar76._8_4_ = (uint)bVar28 * -0x80000000;
          auVar76._12_4_ = (uint)bVar29 * -0x80000000;
          uVar42 = movmskps((int)context,auVar76);
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar42);
          if (uVar42 == 0) goto LAB_006b605d;
          lVar39 = 0;
          if ((byte)uVar42 != 0) {
            for (; ((byte)uVar42 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar41 = *(ulong *)(uVar38 + lVar39 * 8);
          uVar42 = (uVar42 & 0xff) - 1 & uVar42 & 0xff;
          context = (RayQueryContext *)(ulong)uVar42;
        } while (uVar42 == 0);
        do {
          *puVar50 = uVar41;
          puVar50 = puVar50 + 1;
          lVar39 = 0;
          if (context != (RayQueryContext *)0x0) {
            for (; ((ulong)context >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar41 = *(ulong *)(uVar38 + lVar39 * 8);
          context = (RayQueryContext *)((ulong)((long)&context[-1].args + 7) & (ulong)context);
        } while (context != (RayQueryContext *)0x0);
      } while( true );
    }
  }
  return;
LAB_006b61fb:
  if (local_c50 == local_ac8) goto LAB_006b605d;
  lVar39 = local_c50 * 0x90;
  fVar126 = (*(float *)((long)&(This->collider).name + 4) - *(float *)(uVar38 + 0x80 + lVar39)) *
            *(float *)(uVar38 + 0x84 + lVar39);
  uVar41 = *(ulong *)(uVar38 + 0x20 + lVar39);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar41;
  uVar18 = *(ulong *)(uVar38 + 0x24 + lVar39);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar18;
  bVar30 = (byte)uVar18;
  bVar56 = (byte)uVar41;
  bVar31 = (byte)(uVar18 >> 8);
  bVar70 = (byte)(uVar41 >> 8);
  bVar32 = (byte)(uVar18 >> 0x10);
  bVar71 = (byte)(uVar41 >> 0x10);
  bVar33 = (byte)(uVar18 >> 0x18);
  bVar72 = (byte)(uVar41 >> 0x18);
  local_ca8._0_4_ =
       CONCAT13(-((byte)((bVar33 < bVar72) * bVar33 | (bVar33 >= bVar72) * bVar72) == bVar72),
                CONCAT12(-((byte)((bVar32 < bVar71) * bVar32 | (bVar32 >= bVar71) * bVar71) ==
                          bVar71),CONCAT11(-((byte)((bVar31 < bVar70) * bVar31 |
                                                   (bVar31 >= bVar70) * bVar70) == bVar70),
                                           -((byte)((bVar30 < bVar56) * bVar30 |
                                                   (bVar30 >= bVar56) * bVar56) == bVar56))));
  auVar185 = pmovzxbd(auVar100,auVar100);
  fVar166 = *(float *)(uVar38 + 0x38 + lVar39);
  fVar132 = *(float *)(uVar38 + 0x3c + lVar39);
  fVar168 = *(float *)(uVar38 + 0x40 + lVar39);
  fVar73 = *(float *)(uVar38 + 0x44 + lVar39);
  fVar150 = (float)auVar185._0_4_ * fVar73 + fVar166;
  fVar157 = (float)auVar185._4_4_ * fVar73 + fVar166;
  fVar161 = (float)auVar185._8_4_ * fVar73 + fVar166;
  fVar165 = (float)auVar185._12_4_ * fVar73 + fVar166;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(uVar38 + 0x50 + lVar39);
  auVar185 = pmovzxbd(auVar108,auVar108);
  fVar127 = *(float *)(uVar38 + 0x74 + lVar39);
  fVar182 = *(float *)(uVar38 + 0x68 + lVar39);
  auVar100 = pmovzxbd(auVar102,auVar102);
  fVar151 = (float)auVar100._0_4_ * fVar73 + fVar166;
  fVar158 = (float)auVar100._4_4_ * fVar73 + fVar166;
  fVar162 = (float)auVar100._8_4_ * fVar73 + fVar166;
  fVar166 = (float)auVar100._12_4_ * fVar73 + fVar166;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(uVar38 + 0x54 + lVar39);
  auVar100 = pmovzxbd(auVar103,auVar103);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(uVar38 + 0x28 + lVar39);
  auVar108 = pmovzxbd(auVar119,auVar119);
  fVar73 = *(float *)(uVar38 + 0x48 + lVar39);
  fVar137 = (float)auVar108._0_4_ * fVar73 + fVar132;
  fVar144 = (float)auVar108._4_4_ * fVar73 + fVar132;
  fVar146 = (float)auVar108._8_4_ * fVar73 + fVar132;
  fVar134 = (float)auVar108._12_4_ * fVar73 + fVar132;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(uVar38 + 0x58 + lVar39);
  auVar121 = pmovzxbd(auVar120,auVar120);
  fVar148 = *(float *)(uVar38 + 0x78 + lVar39);
  fVar149 = *(float *)(uVar38 + 0x6c + lVar39);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(uVar38 + 0x2c + lVar39);
  auVar108 = pmovzxbd(auVar139,auVar139);
  fVar138 = (float)auVar108._0_4_ * fVar73 + fVar132;
  fVar145 = (float)auVar108._4_4_ * fVar73 + fVar132;
  fVar147 = (float)auVar108._8_4_ * fVar73 + fVar132;
  fVar132 = (float)auVar108._12_4_ * fVar73 + fVar132;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(uVar38 + 0x5c + lVar39);
  auVar102 = pmovzxbd(auVar129,auVar129);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(uVar38 + 0x30 + lVar39);
  auVar108 = pmovzxbd(auVar140,auVar140);
  fVar73 = *(float *)(uVar38 + 0x4c + lVar39);
  fVar152 = (float)auVar108._0_4_ * fVar73 + fVar168;
  fVar159 = (float)auVar108._4_4_ * fVar73 + fVar168;
  fVar163 = (float)auVar108._8_4_ * fVar73 + fVar168;
  fVar167 = (float)auVar108._12_4_ * fVar73 + fVar168;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(uVar38 + 0x60 + lVar39);
  auVar103 = pmovzxbd(auVar141,auVar141);
  fVar170 = *(float *)(uVar38 + 0x7c + lVar39);
  fVar188 = *(float *)(uVar38 + 0x70 + lVar39);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(uVar38 + 0x34 + lVar39);
  auVar108 = pmovzxbd(auVar154,auVar154);
  fVar153 = (float)auVar108._0_4_ * fVar73 + fVar168;
  fVar160 = (float)auVar108._4_4_ * fVar73 + fVar168;
  fVar164 = (float)auVar108._8_4_ * fVar73 + fVar168;
  fVar168 = (float)auVar108._12_4_ * fVar73 + fVar168;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(uVar38 + 100 + lVar39);
  auVar108 = pmovzxbd(auVar109,auVar109);
  fVar73 = (((((float)auVar185._0_4_ * fVar127 + fVar182) - fVar150) * fVar126 + fVar150) -
           auVar184._0_4_) * local_918;
  fVar150 = (((((float)auVar185._4_4_ * fVar127 + fVar182) - fVar157) * fVar126 + fVar157) -
            auVar184._4_4_) * fStack_914;
  fVar157 = (((((float)auVar185._8_4_ * fVar127 + fVar182) - fVar161) * fVar126 + fVar161) -
            auVar184._8_4_) * fStack_910;
  fVar161 = (((((float)auVar185._12_4_ * fVar127 + fVar182) - fVar165) * fVar126 + fVar165) -
            auVar184._12_4_) * fStack_90c;
  fVar165 = (((((float)auVar121._0_4_ * fVar148 + fVar149) - fVar137) * fVar126 + fVar137) -
            local_968) * local_928;
  fVar124 = (((((float)auVar121._4_4_ * fVar148 + fVar149) - fVar144) * fVar126 + fVar144) -
            fStack_964) * fStack_924;
  fVar125 = (((((float)auVar121._8_4_ * fVar148 + fVar149) - fVar146) * fVar126 + fVar146) -
            fStack_960) * fStack_920;
  fVar134 = (((((float)auVar121._12_4_ * fVar148 + fVar149) - fVar134) * fVar126 + fVar134) -
            fStack_95c) * fStack_91c;
  fVar137 = (((((float)auVar100._0_4_ * fVar127 + fVar182) - fVar151) * fVar126 + fVar151) -
            auVar184._0_4_) * local_938;
  fVar144 = (((((float)auVar100._4_4_ * fVar127 + fVar182) - fVar158) * fVar126 + fVar158) -
            auVar184._4_4_) * fStack_934;
  fVar146 = (((((float)auVar100._8_4_ * fVar127 + fVar182) - fVar162) * fVar126 + fVar162) -
            auVar184._8_4_) * fStack_930;
  fVar166 = (((((float)auVar100._12_4_ * fVar127 + fVar182) - fVar166) * fVar126 + fVar166) -
            auVar184._12_4_) * fStack_92c;
  fVar127 = (((((float)auVar102._0_4_ * fVar148 + fVar149) - fVar138) * fVar126 + fVar138) -
            local_968) * local_948;
  fVar182 = (((((float)auVar102._4_4_ * fVar148 + fVar149) - fVar145) * fVar126 + fVar145) -
            fStack_964) * fStack_944;
  fVar138 = (((((float)auVar102._8_4_ * fVar148 + fVar149) - fVar147) * fVar126 + fVar147) -
            fStack_960) * fStack_940;
  fVar132 = (((((float)auVar102._12_4_ * fVar148 + fVar149) - fVar132) * fVar126 + fVar132) -
            fStack_95c) * fStack_93c;
  uVar89 = (uint)((int)fVar137 < (int)fVar73) * (int)fVar137 |
           (uint)((int)fVar137 >= (int)fVar73) * (int)fVar73;
  uVar95 = (uint)((int)fVar144 < (int)fVar150) * (int)fVar144 |
           (uint)((int)fVar144 >= (int)fVar150) * (int)fVar150;
  uVar96 = (uint)((int)fVar146 < (int)fVar157) * (int)fVar146 |
           (uint)((int)fVar146 >= (int)fVar157) * (int)fVar157;
  uVar97 = (uint)((int)fVar166 < (int)fVar161) * (int)fVar166 |
           (uint)((int)fVar166 >= (int)fVar161) * (int)fVar161;
  uVar98 = (uint)((int)fVar137 < (int)fVar73) * (int)fVar73 |
           (uint)((int)fVar137 >= (int)fVar73) * (int)fVar137;
  uVar104 = (uint)((int)fVar144 < (int)fVar150) * (int)fVar150 |
            (uint)((int)fVar144 >= (int)fVar150) * (int)fVar144;
  uVar105 = (uint)((int)fVar146 < (int)fVar157) * (int)fVar157 |
            (uint)((int)fVar146 >= (int)fVar157) * (int)fVar146;
  uVar106 = (uint)((int)fVar166 < (int)fVar161) * (int)fVar161 |
            (uint)((int)fVar166 >= (int)fVar161) * (int)fVar166;
  uVar42 = (uint)((int)fVar127 < (int)fVar165) * (int)fVar127 |
           (uint)((int)fVar127 >= (int)fVar165) * (int)fVar165;
  uVar86 = (uint)((int)fVar182 < (int)fVar124) * (int)fVar182 |
           (uint)((int)fVar182 >= (int)fVar124) * (int)fVar124;
  uVar87 = (uint)((int)fVar138 < (int)fVar125) * (int)fVar138 |
           (uint)((int)fVar138 >= (int)fVar125) * (int)fVar125;
  uVar88 = (uint)((int)fVar132 < (int)fVar134) * (int)fVar132 |
           (uint)((int)fVar132 >= (int)fVar134) * (int)fVar134;
  uVar42 = ((int)uVar42 < (int)uVar89) * uVar89 | ((int)uVar42 >= (int)uVar89) * uVar42;
  uVar86 = ((int)uVar86 < (int)uVar95) * uVar95 | ((int)uVar86 >= (int)uVar95) * uVar86;
  uVar87 = ((int)uVar87 < (int)uVar96) * uVar96 | ((int)uVar87 >= (int)uVar96) * uVar87;
  uVar88 = ((int)uVar88 < (int)uVar97) * uVar97 | ((int)uVar88 >= (int)uVar97) * uVar88;
  uVar89 = (uint)((int)fVar127 < (int)fVar165) * (int)fVar165 |
           (uint)((int)fVar127 >= (int)fVar165) * (int)fVar127;
  uVar95 = (uint)((int)fVar182 < (int)fVar124) * (int)fVar124 |
           (uint)((int)fVar182 >= (int)fVar124) * (int)fVar182;
  uVar96 = (uint)((int)fVar138 < (int)fVar125) * (int)fVar125 |
           (uint)((int)fVar138 >= (int)fVar125) * (int)fVar138;
  uVar97 = (uint)((int)fVar132 < (int)fVar134) * (int)fVar134 |
           (uint)((int)fVar132 >= (int)fVar134) * (int)fVar132;
  fVar127 = (((((float)auVar103._0_4_ * fVar170 + fVar188) - fVar152) * fVar126 + fVar152) - fVar115
            ) * local_958;
  fVar182 = (((((float)auVar103._4_4_ * fVar170 + fVar188) - fVar159) * fVar126 + fVar159) - fVar181
            ) * fStack_954;
  fVar148 = (((((float)auVar103._8_4_ * fVar170 + fVar188) - fVar163) * fVar126 + fVar163) - fVar183
            ) * fStack_950;
  fVar149 = (((((float)auVar103._12_4_ * fVar170 + fVar188) - fVar167) * fVar126 + fVar167) -
            fVar189) * fStack_94c;
  fVar166 = (((((float)auVar108._0_4_ * fVar170 + fVar188) - fVar153) * fVar126 + fVar153) - fVar115
            ) * local_888;
  fVar132 = (((((float)auVar108._4_4_ * fVar170 + fVar188) - fVar160) * fVar126 + fVar160) - fVar181
            ) * fStack_884;
  fVar73 = (((((float)auVar108._8_4_ * fVar170 + fVar188) - fVar164) * fVar126 + fVar164) - fVar183)
           * fVar190;
  fVar168 = (((((float)auVar108._12_4_ * fVar170 + fVar188) - fVar168) * fVar126 + fVar168) -
            fVar189) * fVar191;
  uVar128 = ((int)uVar98 < (int)uVar89) * uVar98 | ((int)uVar98 >= (int)uVar89) * uVar89;
  uVar133 = ((int)uVar104 < (int)uVar95) * uVar104 | ((int)uVar104 >= (int)uVar95) * uVar95;
  uVar135 = ((int)uVar105 < (int)uVar96) * uVar105 | ((int)uVar105 >= (int)uVar96) * uVar96;
  uVar136 = ((int)uVar106 < (int)uVar97) * uVar106 | ((int)uVar106 >= (int)uVar97) * uVar97;
  uVar89 = (uint)((int)fVar166 < (int)fVar127) * (int)fVar166 |
           (uint)((int)fVar166 >= (int)fVar127) * (int)fVar127;
  uVar95 = (uint)((int)fVar132 < (int)fVar182) * (int)fVar132 |
           (uint)((int)fVar132 >= (int)fVar182) * (int)fVar182;
  uVar96 = (uint)((int)fVar73 < (int)fVar148) * (int)fVar73 |
           (uint)((int)fVar73 >= (int)fVar148) * (int)fVar148;
  uVar97 = (uint)((int)fVar168 < (int)fVar149) * (int)fVar168 |
           (uint)((int)fVar168 >= (int)fVar149) * (int)fVar149;
  uVar98 = (uint)((int)fVar166 < (int)fVar127) * (int)fVar127 |
           (uint)((int)fVar166 >= (int)fVar127) * (int)fVar166;
  uVar104 = (uint)((int)fVar132 < (int)fVar182) * (int)fVar182 |
            (uint)((int)fVar132 >= (int)fVar182) * (int)fVar132;
  uVar105 = (uint)((int)fVar73 < (int)fVar148) * (int)fVar148 |
            (uint)((int)fVar73 >= (int)fVar148) * (int)fVar73;
  uVar106 = (uint)((int)fVar168 < (int)fVar149) * (int)fVar149 |
            (uint)((int)fVar168 >= (int)fVar149) * (int)fVar168;
  uVar89 = (uint)((int)uVar89 < (int)fVar117) * (int)fVar117 |
           ((int)uVar89 >= (int)fVar117) * uVar89;
  uVar95 = (uint)((int)uVar95 < (int)fVar57) * (int)fVar57 | ((int)uVar95 >= (int)fVar57) * uVar95;
  uVar96 = (uint)((int)uVar96 < (int)fVar116) * (int)fVar116 |
           ((int)uVar96 >= (int)fVar116) * uVar96;
  uVar97 = (uint)((int)uVar97 < (int)fVar118) * (int)fVar118 |
           ((int)uVar97 >= (int)fVar118) * uVar97;
  iVar37 = auVar177._0_4_;
  uVar98 = (uint)(iVar37 < (int)uVar98) * iVar37 | (iVar37 >= (int)uVar98) * uVar98;
  iVar37 = auVar177._4_4_;
  uVar104 = (uint)(iVar37 < (int)uVar104) * iVar37 | (iVar37 >= (int)uVar104) * uVar104;
  iVar37 = auVar177._8_4_;
  uVar105 = (uint)(iVar37 < (int)uVar105) * iVar37 | (iVar37 >= (int)uVar105) * uVar105;
  iVar37 = auVar177._12_4_;
  uVar106 = (uint)(iVar37 < (int)uVar106) * iVar37 | (iVar37 >= (int)uVar106) * uVar106;
  auVar121._0_4_ =
       -(uint)((int)(((int)uVar128 < (int)uVar98) * uVar128 | ((int)uVar128 >= (int)uVar98) * uVar98
                    ) < (int)(((int)uVar89 < (int)uVar42) * uVar42 |
                             ((int)uVar89 >= (int)uVar42) * uVar89));
  auVar121._4_4_ =
       -(uint)((int)(((int)uVar133 < (int)uVar104) * uVar133 |
                    ((int)uVar133 >= (int)uVar104) * uVar104) <
              (int)(((int)uVar95 < (int)uVar86) * uVar86 | ((int)uVar95 >= (int)uVar86) * uVar95));
  auVar121._8_4_ =
       -(uint)((int)(((int)uVar135 < (int)uVar105) * uVar135 |
                    ((int)uVar135 >= (int)uVar105) * uVar105) <
              (int)(((int)uVar96 < (int)uVar87) * uVar87 | ((int)uVar96 >= (int)uVar87) * uVar96));
  auVar121._12_4_ =
       -(uint)((int)(((int)uVar136 < (int)uVar106) * uVar136 |
                    ((int)uVar136 >= (int)uVar106) * uVar106) <
              (int)(((int)uVar97 < (int)uVar88) * uVar88 | ((int)uVar97 >= (int)uVar88) * uVar97));
  auVar185 = pmovsxbd(auVar184,(undefined4)local_ca8);
  uVar43 = movmskps((int)context,~auVar121 & auVar185);
  local_ac0 = lVar39 + uVar38;
  for (local_c70 = CONCAT44((int)((ulong)context >> 0x20),uVar43); local_c70 != 0;
      local_c70 = local_c70 & local_c70 - 1) {
    lVar39 = 0;
    if (local_c70 != 0) {
      for (; (local_c70 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
      }
    }
    uVar20 = *(ushort *)(local_ac0 + lVar39 * 8);
    uVar21 = *(ushort *)(local_ac0 + 2 + lVar39 * 8);
    local_c20 = (ulong)*(uint *)(local_ac0 + 0x88);
    local_b58 = (ulong)*(uint *)(local_ac0 + 4 + lVar39 * 8);
    local_b40 = *(long *)&(ray->org).field_0;
    lVar39 = *(long *)(*(long *)(local_b40 + 0x1e8) + local_c20 * 8);
    local_b48 = *(long *)(lVar39 + 0x58);
    local_b50 = local_b58 * *(long *)(lVar39 + 0x68);
    fVar57 = *(float *)(lVar39 + 0x2c);
    local_818 = ((*(float *)((long)&(This->collider).name + 4) - fVar57) /
                (*(float *)(lVar39 + 0x30) - fVar57)) * *(float *)(lVar39 + 0x28);
    auVar77 = roundss(ZEXT416((uint)fVar57),ZEXT416((uint)local_818),9);
    fVar57 = *(float *)(lVar39 + 0x28) + -1.0;
    if (fVar57 <= auVar77._0_4_) {
      auVar77._0_4_ = fVar57;
    }
    fVar57 = 0.0;
    if (0.0 <= auVar77._0_4_) {
      fVar57 = auVar77._0_4_;
    }
    uVar86 = uVar20 & 0x7fff;
    uVar87 = uVar21 & 0x7fff;
    uVar42 = *(uint *)(local_b48 + 4 + local_b50);
    uVar44 = (ulong)(uVar42 * uVar87 + *(int *)(local_b48 + local_b50) + uVar86);
    lVar39 = *(long *)(lVar39 + 0xe0);
    lVar47 = (long)(int)fVar57 * 0x38;
    lVar22 = *(long *)(lVar39 + 0x10 + lVar47);
    lVar23 = *(long *)(lVar39 + lVar47);
    pfVar16 = (float *)(lVar23 + lVar22 * uVar44);
    lVar24 = *(long *)(lVar39 + 0x38 + lVar47);
    lVar47 = *(long *)(lVar39 + 0x48 + lVar47);
    pfVar17 = (float *)(lVar24 + lVar47 * uVar44);
    pfVar1 = (float *)(lVar23 + (uVar44 + 1) * lVar22);
    pfVar2 = (float *)(lVar24 + lVar47 * (uVar44 + 1));
    lVar39 = uVar44 + uVar42;
    pfVar3 = (float *)(lVar23 + lVar39 * lVar22);
    pfVar4 = (float *)(lVar24 + lVar47 * lVar39);
    lVar40 = uVar44 + uVar42 + 1;
    pfVar5 = (float *)(lVar23 + lVar40 * lVar22);
    pfVar6 = (float *)(lVar24 + lVar47 * lVar40);
    uVar41 = (ulong)(-1 < (short)uVar20);
    lVar45 = uVar44 + uVar41 + 1;
    pfVar7 = (float *)(lVar23 + lVar45 * lVar22);
    pfVar8 = (float *)(lVar24 + lVar47 * lVar45);
    lVar45 = uVar41 + lVar40;
    pfVar9 = (float *)(lVar23 + lVar45 * lVar22);
    uVar44 = 0;
    if (-1 < (short)uVar21) {
      uVar44 = (ulong)uVar42;
    }
    pfVar10 = (float *)(lVar24 + lVar47 * lVar45);
    pfVar11 = (float *)(lVar23 + (lVar39 + uVar44) * lVar22);
    local_818 = local_818 - fVar57;
    pfVar12 = (float *)(lVar24 + lVar47 * (lVar39 + uVar44));
    lVar39 = (lVar40 + uVar44) * lVar22;
    pfVar13 = (float *)(lVar23 + lVar39);
    pfVar14 = (float *)(lVar24 + lVar47 * (lVar40 + uVar44));
    local_9f8 = (*pfVar2 - *pfVar1) * local_818 + *pfVar1;
    local_8b8 = (pfVar2[1] - pfVar1[1]) * local_818 + pfVar1[1];
    local_9e8 = (pfVar2[2] - pfVar1[2]) * local_818 + pfVar1[2];
    local_9a8 = (*pfVar4 - *pfVar3) * local_818 + *pfVar3;
    local_c48._0_4_ = (pfVar4[1] - pfVar3[1]) * local_818 + pfVar3[1];
    local_b68 = (pfVar4[2] - pfVar3[2]) * local_818 + pfVar3[2];
    local_c38 = (*pfVar6 - *pfVar5) * local_818 + *pfVar5;
    fStack_c34 = (pfVar6[1] - pfVar5[1]) * local_818 + pfVar5[1];
    fStack_c30 = (pfVar6[2] - pfVar5[2]) * local_818 + pfVar5[2];
    fStack_c2c = (pfVar6[3] - pfVar5[3]) * local_818 + pfVar5[3];
    fStack_9f4 = (*pfVar8 - *pfVar7) * local_818 + *pfVar7;
    fStack_8b4 = (pfVar8[1] - pfVar7[1]) * local_818 + pfVar7[1];
    fStack_9e4 = (pfVar8[2] - pfVar7[2]) * local_818 + pfVar7[2];
    fStack_824 = (pfVar10[1] - pfVar9[1]) * local_818 + pfVar9[1];
    fStack_820 = (pfVar10[2] - pfVar9[2]) * local_818 + pfVar9[2];
    fStack_8c4 = (*pfVar12 - *pfVar11) * local_818 + *pfVar11;
    fStack_8bc = (pfVar12[1] - pfVar11[1]) * local_818 + pfVar11[1];
    fStack_814 = local_818;
    fStack_810 = local_818;
    fStack_80c = local_818;
    local_838 = (*pfVar14 - *pfVar13) * local_818 + *pfVar13;
    fStack_834 = (pfVar14[1] - pfVar13[1]) * local_818 + pfVar13[1];
    fStack_830 = (pfVar14[2] - pfVar13[2]) * local_818 + pfVar13[2];
    local_828 = (*pfVar10 - *pfVar9) * local_818 + *pfVar9;
    fStack_81c = (pfVar10[3] - pfVar9[3]) * local_818 + pfVar9[3];
    local_b78 = CONCAT44(fStack_9f4,local_9f8);
    fStack_82c = (pfVar14[3] - pfVar13[3]) * local_818 + pfVar13[3];
    local_998 = *(float *)&local_c60->ptr;
    local_988 = *(float *)((long)&local_c60->ptr + 4);
    local_978 = *(float *)&local_c60->leafIntersector;
    local_ae8._0_4_ = ((pfVar17[1] - pfVar16[1]) * local_818 + pfVar16[1]) - local_988;
    local_ae8._4_4_ = local_8b8 - local_988;
    fStack_ae0 = fStack_c34 - local_988;
    fStack_adc = (float)local_c48._0_4_ - local_988;
    fVar117 = ((pfVar17[2] - pfVar16[2]) * local_818 + pfVar16[2]) - local_978;
    fVar132 = local_9e8 - local_978;
    fVar73 = fStack_c30 - local_978;
    fVar182 = local_b68 - local_978;
    fStack_8c0 = fStack_834;
    local_c48._0_4_ = (float)local_c48._0_4_ - local_988;
    local_c48._4_4_ = fStack_c34 - local_988;
    fStack_c40 = fStack_834 - local_988;
    fStack_c3c = fStack_8bc - local_988;
    local_8a8 = CONCAT44(fStack_c30,local_b68);
    local_b68 = local_b68 - local_978;
    fStack_b64 = fStack_c30 - local_978;
    fStack_b60 = fStack_830 - local_978;
    fStack_b5c = ((pfVar12[2] - pfVar11[2]) * local_818 + pfVar11[2]) - local_978;
    local_b18 = (float)local_c48._0_4_ - (float)local_ae8._0_4_;
    fStack_b14 = (float)local_c48._4_4_ - (float)local_ae8._4_4_;
    fStack_b10 = fStack_c40 - fStack_ae0;
    fStack_b0c = fStack_c3c - fStack_adc;
    local_b08._0_4_ = local_b68 - fVar117;
    local_b08._4_4_ = fStack_b64 - fVar132;
    fStack_b00 = fStack_b60 - fVar73;
    fStack_afc = fStack_b5c - fVar182;
    local_ad8 = ((*pfVar17 - *pfVar16) * local_818 + *pfVar16) - local_998;
    fStack_ad4 = local_9f8 - local_998;
    fStack_ad0 = local_c38 - local_998;
    fStack_acc = local_9a8 - local_998;
    local_8d8 = CONCAT44(local_c38,local_9a8);
    local_8c8 = local_838;
    local_9a8 = local_9a8 - local_998;
    fStack_9a4 = local_c38 - local_998;
    fStack_9a0 = local_838 - local_998;
    fStack_99c = fStack_8c4 - local_998;
    local_7e8 = local_9a8 - local_ad8;
    fStack_7e4 = fStack_9a4 - fStack_ad4;
    fStack_7e0 = fStack_9a0 - fStack_ad0;
    fStack_7dc = fStack_99c - fStack_acc;
    fStack_c80 = *(float *)&(local_c60->collider).collide;
    fStack_ca0 = *(float *)((long)&(local_c60->collider).collide + 4);
    local_c18._0_4_ = *(float *)&(local_c60->collider).name;
    fVar125 = (local_b18 * (local_b68 + fVar117) -
              (float)local_b08._0_4_ * ((float)local_c48._0_4_ + (float)local_ae8._0_4_)) *
              fStack_c80 +
              ((float)local_b08._0_4_ * (local_9a8 + local_ad8) - (local_b68 + fVar117) * local_7e8)
              * fStack_ca0 +
              (((float)local_c48._0_4_ + (float)local_ae8._0_4_) * local_7e8 -
              (local_9a8 + local_ad8) * local_b18) * (float)local_c18;
    fVar134 = (fStack_b14 * (fStack_b64 + fVar132) -
              (float)local_b08._4_4_ * ((float)local_c48._4_4_ + (float)local_ae8._4_4_)) *
              fStack_c80 +
              ((float)local_b08._4_4_ * (fStack_9a4 + fStack_ad4) -
              (fStack_b64 + fVar132) * fStack_7e4) * fStack_ca0 +
              (((float)local_c48._4_4_ + (float)local_ae8._4_4_) * fStack_7e4 -
              (fStack_9a4 + fStack_ad4) * fStack_b14) * (float)local_c18;
    fStack_c90 = (fStack_b10 * (fStack_b60 + fVar73) - fStack_b00 * (fStack_c40 + fStack_ae0)) *
                 fStack_c80 +
                 (fStack_b00 * (fStack_9a0 + fStack_ad0) - (fStack_b60 + fVar73) * fStack_7e0) *
                 fStack_ca0 +
                 ((fStack_c40 + fStack_ae0) * fStack_7e0 - (fStack_9a0 + fStack_ad0) * fStack_b10) *
                 (float)local_c18;
    fStack_c8c = (fStack_b0c * (fStack_b5c + fVar182) - fStack_afc * (fStack_c3c + fStack_adc)) *
                 fStack_c80 +
                 (fStack_afc * (fStack_99c + fStack_acc) - (fStack_b5c + fVar182) * fStack_7dc) *
                 fStack_ca0 +
                 ((fStack_c3c + fStack_adc) * fStack_7dc - (fStack_99c + fStack_acc) * fStack_b0c) *
                 (float)local_c18;
    fStack_8b0 = fStack_824;
    fStack_8ac = fStack_c34;
    fStack_984 = local_988;
    fStack_980 = local_988;
    fStack_97c = local_988;
    local_9d8 = local_8b8 - local_988;
    fStack_9d4 = fStack_8b4 - local_988;
    fStack_9d0 = fStack_824 - local_988;
    fStack_9cc = fStack_c34 - local_988;
    local_898 = CONCAT44(fStack_9e4,local_9e8);
    local_888 = fStack_820;
    fStack_884 = fStack_c30;
    fStack_974 = local_978;
    fStack_970 = local_978;
    fStack_96c = local_978;
    local_9e8 = local_9e8 - local_978;
    fStack_9e4 = fStack_9e4 - local_978;
    fStack_9e0 = fStack_820 - local_978;
    fStack_9dc = fStack_c30 - local_978;
    local_af8._0_4_ = (float)local_ae8._0_4_ - local_9d8;
    local_af8._4_4_ = (float)local_ae8._4_4_ - fStack_9d4;
    fStack_af0 = fStack_ae0 - fStack_9d0;
    fStack_aec = fStack_adc - fStack_9cc;
    local_7f8 = fVar117 - local_9e8;
    fStack_7f4 = fVar132 - fStack_9e4;
    fStack_7f0 = fVar73 - fStack_9e0;
    fStack_7ec = fVar182 - fStack_9dc;
    fStack_994 = local_998;
    fStack_990 = local_998;
    fStack_98c = local_998;
    local_9f8 = local_9f8 - local_998;
    fStack_9f4 = fStack_9f4 - local_998;
    fStack_9f0 = fStack_b70 - local_998;
    fStack_9ec = fStack_b6c - local_998;
    fVar118 = local_ad8 - local_9f8;
    fVar168 = fStack_ad4 - fStack_9f4;
    fVar127 = fStack_ad0 - fStack_9f0;
    fVar148 = fStack_acc - fStack_9ec;
    local_808 = ((float)local_af8._0_4_ * (fVar117 + local_9e8) -
                local_7f8 * ((float)local_ae8._0_4_ + local_9d8)) * fStack_c80 +
                (local_7f8 * (local_ad8 + local_9f8) - (fVar117 + local_9e8) * fVar118) * fStack_ca0
                + (((float)local_ae8._0_4_ + local_9d8) * fVar118 -
                  (local_ad8 + local_9f8) * (float)local_af8._0_4_) * (float)local_c18;
    fStack_804 = ((float)local_af8._4_4_ * (fVar132 + fStack_9e4) -
                 fStack_7f4 * ((float)local_ae8._4_4_ + fStack_9d4)) * fStack_c80 +
                 (fStack_7f4 * (fStack_ad4 + fStack_9f4) - (fVar132 + fStack_9e4) * fVar168) *
                 fStack_ca0 +
                 (((float)local_ae8._4_4_ + fStack_9d4) * fVar168 -
                 (fStack_ad4 + fStack_9f4) * (float)local_af8._4_4_) * (float)local_c18;
    fStack_800 = (fStack_af0 * (fVar73 + fStack_9e0) - fStack_7f0 * (fStack_ae0 + fStack_9d0)) *
                 fStack_c80 +
                 (fStack_7f0 * (fStack_ad0 + fStack_9f0) - (fVar73 + fStack_9e0) * fVar127) *
                 fStack_ca0 +
                 ((fStack_ae0 + fStack_9d0) * fVar127 - (fStack_ad0 + fStack_9f0) * fStack_af0) *
                 (float)local_c18;
    fStack_7fc = (fStack_aec * (fVar182 + fStack_9dc) - fStack_7ec * (fStack_adc + fStack_9cc)) *
                 fStack_c80 +
                 (fStack_7ec * (fStack_acc + fStack_9ec) - (fVar182 + fStack_9dc) * fVar148) *
                 fStack_ca0 +
                 ((fStack_adc + fStack_9cc) * fVar148 - (fStack_acc + fStack_9ec) * fStack_aec) *
                 (float)local_c18;
    fVar149 = local_9d8 - (float)local_c48._0_4_;
    fVar170 = fStack_9d4 - (float)local_c48._4_4_;
    fVar188 = fStack_9d0 - fStack_c40;
    fVar150 = fStack_9cc - fStack_c3c;
    fVar144 = local_9e8 - local_b68;
    fVar146 = fStack_9e4 - fStack_b64;
    fVar165 = fStack_9e0 - fStack_b60;
    fVar124 = fStack_9dc - fStack_b5c;
    local_9b8 = local_9d8 + (float)local_c48._0_4_;
    fStack_9b4 = fStack_9d4 + (float)local_c48._4_4_;
    fStack_9b0 = fStack_9d0 + fStack_c40;
    fStack_9ac = fStack_9cc + fStack_c3c;
    local_9c8 = local_9e8 + local_b68;
    fStack_9c4 = fStack_9e4 + fStack_b64;
    fStack_9c0 = fStack_9e0 + fStack_b60;
    fStack_9bc = fStack_9dc + fStack_b5c;
    fVar57 = local_9f8 - local_9a8;
    fVar166 = fStack_9f4 - fStack_9a4;
    fVar115 = fStack_9f0 - fStack_9a0;
    fVar116 = fStack_9ec - fStack_99c;
    local_a08 = local_9f8 + local_9a8;
    fStack_a04 = fStack_9f4 + fStack_9a4;
    fStack_a00 = fStack_9f0 + fStack_9a0;
    fStack_9fc = fStack_9ec + fStack_99c;
    local_c18._4_4_ = (float)local_c18;
    fStack_c10 = (float)local_c18;
    fStack_c0c = (float)local_c18;
    auVar58._0_4_ =
         (fVar149 * local_9c8 - fVar144 * local_9b8) * fStack_c80 +
         (fVar144 * local_a08 - fVar57 * local_9c8) * fStack_ca0 +
         (fVar57 * local_9b8 - fVar149 * local_a08) * (float)local_c18;
    auVar58._4_4_ =
         (fVar170 * fStack_9c4 - fVar146 * fStack_9b4) * fStack_c80 +
         (fVar146 * fStack_a04 - fVar166 * fStack_9c4) * fStack_ca0 +
         (fVar166 * fStack_9b4 - fVar170 * fStack_a04) * (float)local_c18;
    auVar58._8_4_ =
         (fVar188 * fStack_9c0 - fVar165 * fStack_9b0) * fStack_c80 +
         (fVar165 * fStack_a00 - fVar115 * fStack_9c0) * fStack_ca0 +
         (fVar115 * fStack_9b0 - fVar188 * fStack_a00) * (float)local_c18;
    auVar58._12_4_ =
         (fVar150 * fStack_9bc - fVar124 * fStack_9ac) * fStack_c80 +
         (fVar124 * fStack_9fc - fVar116 * fStack_9bc) * fStack_ca0 +
         (fVar116 * fStack_9ac - fVar150 * fStack_9fc) * (float)local_c18;
    auVar36._4_4_ = fVar134;
    auVar36._0_4_ = fVar125;
    auVar36._8_4_ = fStack_c90;
    auVar36._12_4_ = fStack_c8c;
    local_b88 = fVar125 + local_808 + auVar58._0_4_;
    fStack_b84 = fVar134 + fStack_804 + auVar58._4_4_;
    fStack_b80 = fStack_c90 + fStack_800 + auVar58._8_4_;
    fStack_b7c = fStack_c8c + fStack_7fc + auVar58._12_4_;
    auVar34._4_4_ = fStack_804;
    auVar34._0_4_ = local_808;
    auVar34._8_4_ = fStack_800;
    auVar34._12_4_ = fStack_7fc;
    auVar185 = minps(auVar36,auVar34);
    auVar185 = minps(auVar185,auVar58);
    auVar35._4_4_ = fStack_804;
    auVar35._0_4_ = local_808;
    auVar35._8_4_ = fStack_800;
    auVar35._12_4_ = fStack_7fc;
    auVar184 = maxps(auVar36,auVar35);
    auVar184 = maxps(auVar184,auVar58);
    fVar157 = ABS(local_b88);
    fVar161 = ABS(fStack_b84);
    fVar126 = ABS(fStack_b80);
    fVar137 = ABS(fStack_b7c);
    auVar169._0_4_ =
         -(uint)(auVar184._0_4_ <= fVar157 * 1.1920929e-07 ||
                -(fVar157 * 1.1920929e-07) <= auVar185._0_4_) & local_908;
    auVar169._4_4_ =
         -(uint)(auVar184._4_4_ <= fVar161 * 1.1920929e-07 ||
                -(fVar161 * 1.1920929e-07) <= auVar185._4_4_) & uStack_904;
    auVar169._8_4_ =
         -(uint)(auVar184._8_4_ <= fVar126 * 1.1920929e-07 ||
                -(fVar126 * 1.1920929e-07) <= auVar185._8_4_) & uStack_900;
    auVar169._12_4_ =
         -(uint)(auVar184._12_4_ <= fVar137 * 1.1920929e-07 ||
                -(fVar137 * 1.1920929e-07) <= auVar185._12_4_) & uStack_8fc;
    iVar37 = movmskps((int)lVar39,auVar169);
    puVar15 = (undefined8 *)(lVar23 + lVar22 * (uVar44 + lVar45));
    local_b98 = *puVar15;
    uStack_b90 = puVar15[1];
    puVar15 = (undefined8 *)(lVar24 + (uVar44 + lVar45) * lVar47);
    local_848 = *puVar15;
    uStack_840 = puVar15[1];
    local_b28 = ZEXT416(uVar86);
    local_b38 = ZEXT416(uVar87);
    local_ca8._4_4_ = fStack_ca0;
    local_c88._4_4_ = fStack_c80;
    if (iVar37 == 0) {
      iVar37 = 0;
LAB_006b70cb:
      auVar171._4_4_ = fStack_c34;
      auVar171._0_4_ = local_c38;
      auVar171._8_4_ = fStack_c30;
    }
    else {
      local_8e8 = fVar157;
      fStack_8e4 = fVar161;
      fStack_8e0 = fVar126;
      fStack_8dc = fVar137;
      auVar78._0_4_ = local_b18 * local_7f8 - (float)local_b08._0_4_ * (float)local_af8._0_4_;
      auVar78._4_4_ = fStack_b14 * fStack_7f4 - (float)local_b08._4_4_ * (float)local_af8._4_4_;
      auVar78._8_4_ = fStack_b10 * fStack_7f0 - fStack_b00 * fStack_af0;
      auVar78._12_4_ = fStack_b0c * fStack_7ec - fStack_afc * fStack_aec;
      auVar172._0_4_ = (float)local_af8._0_4_ * fVar144 - local_7f8 * fVar149;
      auVar172._4_4_ = (float)local_af8._4_4_ * fVar146 - fStack_7f4 * fVar170;
      auVar172._8_4_ = fStack_af0 * fVar165 - fStack_7f0 * fVar188;
      auVar172._12_4_ = fStack_aec * fVar124 - fStack_7ec * fVar150;
      auVar59._4_4_ =
           -(uint)(ABS((float)local_b08._4_4_ * (float)local_af8._4_4_) < ABS(fStack_7f4 * fVar170))
      ;
      auVar59._0_4_ =
           -(uint)(ABS((float)local_b08._0_4_ * (float)local_af8._0_4_) < ABS(local_7f8 * fVar149));
      auVar59._8_4_ = -(uint)(ABS(fStack_b00 * fStack_af0) < ABS(fStack_7f0 * fVar188));
      auVar59._12_4_ = -(uint)(ABS(fStack_afc * fStack_aec) < ABS(fStack_7ec * fVar150));
      local_a38 = blendvps(auVar172,auVar78,auVar59);
      auVar155._0_4_ = (float)local_b08._0_4_ * fVar118 - local_7e8 * local_7f8;
      auVar155._4_4_ = (float)local_b08._4_4_ * fVar168 - fStack_7e4 * fStack_7f4;
      auVar155._8_4_ = fStack_b00 * fVar127 - fStack_7e0 * fStack_7f0;
      auVar155._12_4_ = fStack_afc * fVar148 - fStack_7dc * fStack_7ec;
      auVar175._0_4_ = local_7f8 * fVar57 - fVar118 * fVar144;
      auVar175._4_4_ = fStack_7f4 * fVar166 - fVar168 * fVar146;
      auVar175._8_4_ = fStack_7f0 * fVar115 - fVar127 * fVar165;
      auVar175._12_4_ = fStack_7ec * fVar116 - fVar148 * fVar124;
      auVar60._4_4_ = -(uint)(ABS(fStack_7e4 * fStack_7f4) < ABS(fVar168 * fVar146));
      auVar60._0_4_ = -(uint)(ABS(local_7e8 * local_7f8) < ABS(fVar118 * fVar144));
      auVar60._8_4_ = -(uint)(ABS(fStack_7e0 * fStack_7f0) < ABS(fVar127 * fVar165));
      auVar60._12_4_ = -(uint)(ABS(fStack_7dc * fStack_7ec) < ABS(fVar148 * fVar124));
      local_a28 = blendvps(auVar175,auVar155,auVar60);
      auVar186._0_4_ = local_7e8 * (float)local_af8._0_4_ - local_b18 * fVar118;
      auVar186._4_4_ = fStack_7e4 * (float)local_af8._4_4_ - fStack_b14 * fVar168;
      auVar186._8_4_ = fStack_7e0 * fStack_af0 - fStack_b10 * fVar127;
      auVar186._12_4_ = fStack_7dc * fStack_aec - fStack_b0c * fVar148;
      auVar122._0_4_ = fVar118 * fVar149 - (float)local_af8._0_4_ * fVar57;
      auVar122._4_4_ = fVar168 * fVar170 - (float)local_af8._4_4_ * fVar166;
      auVar122._8_4_ = fVar127 * fVar188 - fStack_af0 * fVar115;
      auVar122._12_4_ = fVar148 * fVar150 - fStack_aec * fVar116;
      auVar61._4_4_ = -(uint)(ABS(fStack_b14 * fVar168) < ABS((float)local_af8._4_4_ * fVar166));
      auVar61._0_4_ = -(uint)(ABS(local_b18 * fVar118) < ABS((float)local_af8._0_4_ * fVar57));
      auVar61._8_4_ = -(uint)(ABS(fStack_b10 * fVar127) < ABS(fStack_af0 * fVar115));
      auVar61._12_4_ = -(uint)(ABS(fStack_b0c * fVar148) < ABS(fStack_aec * fVar116));
      local_a18 = blendvps(auVar122,auVar186,auVar61);
      fVar127 = local_a18._4_4_;
      fVar148 = local_a18._8_4_;
      fVar149 = local_a18._12_4_;
      fVar57 = fStack_c80 * local_a38._0_4_ +
               fStack_ca0 * local_a28._0_4_ + (float)local_c18 * local_a18._0_4_;
      fVar166 = fStack_c80 * local_a38._4_4_ +
                fStack_ca0 * local_a28._4_4_ + (float)local_c18 * fVar127;
      fVar115 = fStack_c80 * local_a38._8_4_ +
                fStack_ca0 * local_a28._8_4_ + (float)local_c18 * fVar148;
      fVar116 = fStack_c80 * local_a38._12_4_ +
                fStack_ca0 * local_a28._12_4_ + (float)local_c18 * fVar149;
      auVar62._0_4_ = fVar57 + fVar57;
      auVar62._4_4_ = fVar166 + fVar166;
      auVar62._8_4_ = fVar115 + fVar115;
      auVar62._12_4_ = fVar116 + fVar116;
      auVar92._0_4_ = (float)local_ae8._0_4_ * local_a28._0_4_ + fVar117 * local_a18._0_4_;
      auVar92._4_4_ = (float)local_ae8._4_4_ * local_a28._4_4_ + fVar132 * fVar127;
      auVar92._8_4_ = fStack_ae0 * local_a28._8_4_ + fVar73 * fVar148;
      auVar92._12_4_ = fStack_adc * local_a28._12_4_ + fVar182 * fVar149;
      fVar117 = local_ad8 * local_a38._0_4_ + auVar92._0_4_;
      fVar118 = fStack_ad4 * local_a38._4_4_ + auVar92._4_4_;
      fVar132 = fStack_ad0 * local_a38._8_4_ + auVar92._8_4_;
      fVar168 = fStack_acc * local_a38._12_4_ + auVar92._12_4_;
      auVar185 = rcpps(auVar92,auVar62);
      fVar57 = auVar185._0_4_;
      fVar166 = auVar185._4_4_;
      fVar115 = auVar185._8_4_;
      fVar116 = auVar185._12_4_;
      local_a48._0_4_ = ((1.0 - auVar62._0_4_ * fVar57) * fVar57 + fVar57) * (fVar117 + fVar117);
      local_a48._4_4_ = ((1.0 - auVar62._4_4_ * fVar166) * fVar166 + fVar166) * (fVar118 + fVar118);
      fStack_a40 = ((1.0 - auVar62._8_4_ * fVar115) * fVar115 + fVar115) * (fVar132 + fVar132);
      fStack_a3c = ((1.0 - auVar62._12_4_ * fVar116) * fVar116 + fVar116) * (fVar168 + fVar168);
      local_ba8 = (undefined1  [8])(local_c60->intersector1).intersect;
      unique0x00006c88 = (local_c60->intersector1).occluded;
      fVar166 = SUB84(local_ba8,0);
      fVar57 = *(float *)((long)&local_c60->leafIntersector + 4);
      auVar63._0_4_ =
           (int)((uint)(auVar62._0_4_ != 0.0 &&
                       ((float)local_a48._0_4_ <= fVar166 && fVar57 <= (float)local_a48._0_4_)) *
                -0x80000000) >> 0x1f;
      auVar63._4_4_ =
           (int)((uint)(auVar62._4_4_ != 0.0 &&
                       ((float)local_a48._4_4_ <= fVar166 && fVar57 <= (float)local_a48._4_4_)) *
                -0x80000000) >> 0x1f;
      auVar63._8_4_ =
           (int)((uint)(auVar62._8_4_ != 0.0 && (fStack_a40 <= fVar166 && fVar57 <= fStack_a40)) *
                -0x80000000) >> 0x1f;
      auVar63._12_4_ =
           (int)((uint)(auVar62._12_4_ != 0.0 && (fStack_a3c <= fVar166 && fVar57 <= fStack_a3c)) *
                -0x80000000) >> 0x1f;
      iVar37 = movmskps(iVar37,auVar63 & auVar169);
      if (iVar37 == 0) goto LAB_006b70cb;
      uVar46 = extractps(_local_ba8,1);
      local_a98._4_4_ = fStack_b84;
      local_a98._0_4_ = local_b88;
      local_a98._8_4_ = fStack_b80;
      local_a98._12_4_ = fStack_b7c;
      local_a88 = &local_ca9;
      local_a78 = auVar63 & auVar169;
      auVar79._4_12_ = local_a48._4_12_;
      auVar79._0_4_ = (float)(int)(*(ushort *)(local_b48 + 8 + local_b50) - 1);
      auVar110._4_4_ = local_a48._4_4_;
      auVar110._0_4_ = auVar79._0_4_;
      auVar110._8_4_ = fStack_a40;
      auVar110._12_4_ = fStack_a3c;
      auVar185 = rcpss(auVar110,auVar79);
      auVar123._0_4_ = (float)(int)(*(ushort *)(local_b48 + 10 + local_b50) - 1);
      auVar123._4_12_ = local_a18._4_12_;
      fStack_aac = (2.0 - auVar79._0_4_ * auVar185._0_4_) * auVar185._0_4_;
      auVar111._4_4_ = fVar127;
      auVar111._0_4_ = auVar123._0_4_;
      auVar111._8_4_ = fVar148;
      auVar111._12_4_ = fVar149;
      auVar185 = rcpss(auVar111,auVar123);
      fVar57 = (2.0 - auVar123._0_4_ * auVar185._0_4_) * auVar185._0_4_;
      local_ab8 = fStack_aac * (fVar125 + (float)uVar86 * local_b88);
      fStack_ab4 = fStack_aac * (fVar134 + (float)(uVar86 + 1) * fStack_b84);
      fStack_ab0 = fStack_aac * (fStack_c90 + (float)(uVar86 + 1) * fStack_b80);
      fStack_aac = fStack_aac * (fStack_c8c + (float)uVar86 * fStack_b7c);
      auVar93._0_4_ = (float)uVar87 * local_b88 + local_808;
      auVar93._4_4_ = (float)uVar87 * fStack_b84 + fStack_804;
      auVar93._8_4_ = (float)(uVar87 + 1) * fStack_b80 + fStack_800;
      auVar93._12_4_ = (float)(uVar87 + 1) * fStack_b7c + fStack_7fc;
      local_aa8._4_4_ = fVar57 * auVar93._4_4_;
      local_aa8._0_4_ = fVar57 * auVar93._0_4_;
      fStack_aa0 = fVar57 * auVar93._8_4_;
      fStack_a9c = fVar57 * auVar93._12_4_;
      lVar39 = *(long *)(*(long *)(local_b40 + 0x1e8) + local_c20 * 8);
      local_c98 = (undefined4)lVar39;
      uStack_c94 = (undefined4)((ulong)lVar39 >> 0x20);
      auVar171._4_4_ = fStack_c34;
      auVar171._0_4_ = local_c38;
      auVar171._8_4_ = fStack_c30;
      auVar173._12_4_ = fStack_c2c;
      auVar173._0_12_ = auVar171;
      if ((*(uint *)(lVar39 + 0x34) & (uint)uVar46) != 0) {
        local_ca8 = *(byte **)&(local_c28->dir).field_0;
        if ((*(long *)(local_ca8 + 0x10) == 0) && (*(long *)(lVar39 + 0x48) == 0))
        goto LAB_006b7a56;
        auVar185 = rcpps(auVar93,local_a98);
        fVar166 = auVar185._0_4_;
        fVar115 = auVar185._4_4_;
        fVar116 = auVar185._8_4_;
        fVar117 = auVar185._12_4_;
        fVar166 = (float)(-(uint)(1e-18 <= fVar157) &
                         (uint)(((float)DAT_01f46a60 - local_b88 * fVar166) * fVar166 + fVar166));
        fVar115 = (float)(-(uint)(1e-18 <= fVar161) &
                         (uint)((DAT_01f46a60._4_4_ - fStack_b84 * fVar115) * fVar115 + fVar115));
        fVar116 = (float)(-(uint)(1e-18 <= fVar126) &
                         (uint)((DAT_01f46a60._8_4_ - fStack_b80 * fVar116) * fVar116 + fVar116));
        fVar117 = (float)(-(uint)(1e-18 <= fVar137) &
                         (uint)((DAT_01f46a60._12_4_ - fStack_b7c * fVar117) * fVar117 + fVar117));
        auVar64._0_4_ = local_ab8 * fVar166;
        auVar64._4_4_ = fStack_ab4 * fVar115;
        auVar64._8_4_ = fStack_ab0 * fVar116;
        auVar64._12_4_ = fStack_aac * fVar117;
        local_a68 = minps(auVar64,_DAT_01f46a60);
        auVar80._0_4_ = fVar57 * auVar93._0_4_ * fVar166;
        auVar80._4_4_ = fVar57 * auVar93._4_4_ * fVar115;
        auVar80._8_4_ = fVar57 * auVar93._8_4_ * fVar116;
        auVar80._12_4_ = fVar57 * auVar93._12_4_ * fVar117;
        local_a58 = minps(auVar80,_DAT_01f46a60);
        local_c18 = (undefined4 *)(ulong)(byte)iVar37;
        local_c88 = 0;
        if (local_c18 != (undefined4 *)0x0) {
          for (; ((byte)iVar37 >> local_c88 & 1) == 0; local_c88 = local_c88 + 1) {
          }
        }
        local_c48 = (undefined1  [8])*(undefined8 *)((long)&(local_c28->org).field_0 + 8);
        fStack_c9c = fStack_ca0;
        fStack_c7c = fStack_c80;
        while (auVar171 = auVar173._0_12_, local_c18 != (undefined4 *)0x0) {
          local_bfc = *(undefined4 *)(local_a68 + local_c88 * 4);
          local_bf8 = *(undefined4 *)(local_a58 + local_c88 * 4);
          *(undefined4 *)&(local_c60->intersector1).intersect =
               *(undefined4 *)(local_a48 + local_c88 * 4);
          local_c08 = *(undefined4 *)(local_a38 + local_c88 * 4);
          local_c04 = *(undefined4 *)(local_a28 + local_c88 * 4);
          local_c00 = *(undefined4 *)(local_a18 + local_c88 * 4);
          local_bf4 = (undefined4)local_b58;
          local_bf0 = (undefined4)local_c20;
          local_bec = *(undefined4 *)local_c48;
          local_be8 = *(undefined4 *)((long)local_c48 + 4);
          local_c74 = -1;
          local_bd8 = &local_c74;
          local_bd0 = *(undefined8 *)(CONCAT44(uStack_c94,local_c98) + 0x18);
          local_bc8 = (undefined4 *)local_c48;
          local_bc0 = local_c60;
          local_bb8 = &local_c08;
          local_bb0 = 1;
          pcVar25 = *(code **)(CONCAT44(uStack_c94,local_c98) + 0x48);
          if (((pcVar25 == (code *)0x0) || ((*pcVar25)(&local_bd8), *local_bd8 != 0)) &&
             ((*(code **)(local_ca8 + 0x10) == (code *)0x0 ||
              ((((*local_ca8 & 2) == 0 &&
                ((*(byte *)(CONCAT44(uStack_c94,local_c98) + 0x3e) & 0x40) == 0)) ||
               ((**(code **)(local_ca8 + 0x10))(&local_bd8), *local_bd8 != 0))))))
          goto LAB_006b7a56;
          *(undefined4 *)&(local_c60->intersector1).intersect = local_ba8._0_4_;
          local_c18 = (undefined4 *)((ulong)local_c18 ^ 1L << (local_c88 & 0x3f));
          local_c88 = 0;
          if (local_c18 != (undefined4 *)0x0) {
            for (; ((ulong)local_c18 >> local_c88 & 1) == 0; local_c88 = local_c88 + 1) {
            }
          }
          auVar173._4_4_ = fStack_c34;
          auVar173._0_4_ = local_c38;
          auVar173._8_4_ = fStack_c30;
          auVar173._12_4_ = fStack_c2c;
        }
        local_998 = *(float *)&local_c60->ptr;
        local_988 = *(float *)((long)&local_c60->ptr + 4);
        local_978 = *(float *)&local_c60->leafIntersector;
        local_c88._4_4_ = *(float *)&(local_c60->collider).collide;
        local_ca8._4_4_ = *(float *)((long)&(local_c60->collider).collide + 4);
        local_c18._0_4_ = *(float *)&(local_c60->collider).name;
        local_c18._4_4_ = (float)local_c18;
        fStack_c10 = (float)local_c18;
        fStack_c0c = (float)local_c18;
        local_b68 = (float)local_8a8 - local_978;
        fStack_b64 = local_8a8._4_4_ - local_978;
        fStack_b60 = fStack_8a0 - local_978;
        fStack_b5c = fStack_89c - local_978;
        fStack_994 = local_998;
        fStack_990 = local_998;
        fStack_98c = local_998;
        fStack_984 = local_988;
        fStack_980 = local_988;
        fStack_97c = local_988;
        fStack_974 = local_978;
        fStack_970 = local_978;
        fStack_96c = local_978;
        local_a08 = ((float)local_8d8 - local_998) + ((float)local_b78 - local_998);
        fStack_a04 = (local_8d8._4_4_ - local_998) + (local_b78._4_4_ - local_998);
        fStack_a00 = (fStack_8d0 - local_998) + (fStack_b70 - local_998);
        fStack_9fc = (fStack_8cc - local_998) + (fStack_b6c - local_998);
        local_9b8 = (local_8c8 - local_988) + (local_8b8 - local_988);
        fStack_9b4 = (fStack_8c4 - local_988) + (fStack_8b4 - local_988);
        fStack_9b0 = (fStack_8c0 - local_988) + (fStack_8b0 - local_988);
        fStack_9ac = (fStack_8bc - local_988) + (fStack_8ac - local_988);
        local_9c8 = local_b68 + ((float)local_898 - local_978);
        fStack_9c4 = fStack_b64 + (local_898._4_4_ - local_978);
        fStack_9c0 = fStack_b60 + (fStack_890 - local_978);
        fStack_9bc = fStack_b5c + (fStack_88c - local_978);
        local_9e8 = (float)local_898 - local_978;
        fStack_9e4 = local_898._4_4_ - local_978;
        fStack_9e0 = fStack_890 - local_978;
        fStack_9dc = fStack_88c - local_978;
        local_9d8 = local_8b8 - local_988;
        fStack_9d4 = fStack_8b4 - local_988;
        fStack_9d0 = fStack_8b0 - local_988;
        fStack_9cc = fStack_8ac - local_988;
        local_9f8 = (float)local_b78 - local_998;
        fStack_9f4 = local_b78._4_4_ - local_998;
        fStack_9f0 = fStack_b70 - local_998;
        fStack_9ec = fStack_b6c - local_998;
        local_c48._4_4_ = fStack_8c4 - local_988;
        local_c48._0_4_ = local_8c8 - local_988;
        fStack_c40 = fStack_8c0 - local_988;
        fStack_c3c = fStack_8bc - local_988;
        local_9a8 = (float)local_8d8 - local_998;
        fStack_9a4 = local_8d8._4_4_ - local_998;
        fStack_9a0 = fStack_8d0 - local_998;
        fStack_99c = fStack_8cc - local_998;
        iVar37 = 0;
      }
    }
    fStack_c10 = local_c18._4_4_;
    local_c38 = auVar171._8_4_ - fStack_96c;
    fStack_c34 = fStack_820 - fStack_96c;
    fStack_c30 = (fStack_810 * ((float)uStack_840 - (float)uStack_b90) + (float)uStack_b90) -
                 fStack_96c;
    fStack_c2c = fStack_830 - fStack_96c;
    fVar138 = auVar171._0_4_ - fStack_98c;
    fVar145 = local_828 - fStack_98c;
    fVar147 = (local_818 * ((float)local_848 - (float)local_b98) + (float)local_b98) - fStack_98c;
    fVar181 = local_838 - fStack_98c;
    local_ba8._0_4_ = auVar171._4_4_ - fStack_97c;
    local_ba8._4_4_ = fStack_824 - fStack_97c;
    fStack_ba0 = (fStack_814 * (local_848._4_4_ - local_b98._4_4_) + local_b98._4_4_) - fStack_97c;
    fStack_b9c = fStack_834 - fStack_97c;
    fVar183 = local_9d8 - (float)local_ba8._0_4_;
    fVar189 = fStack_9d4 - (float)local_ba8._4_4_;
    fVar190 = fStack_9d0 - fStack_ba0;
    fVar191 = fStack_9cc - fStack_b9c;
    local_b88 = local_9e8 - local_c38;
    fStack_b84 = fStack_9e4 - fStack_c34;
    fStack_b80 = fStack_9e0 - fStack_c30;
    fStack_b7c = fStack_9dc - fStack_c2c;
    fVar57 = (float)local_c48._0_4_ - local_9d8;
    fVar115 = (float)local_c48._4_4_ - fStack_9d4;
    fStack_c90 = fStack_c40 - fStack_9d0;
    fStack_c8c = fStack_c3c - fStack_9cc;
    fVar73 = local_b68 - local_9e8;
    fVar127 = fStack_b64 - fStack_9e4;
    fVar182 = fStack_b60 - fStack_9e0;
    fVar148 = fStack_b5c - fStack_9dc;
    local_ad8 = local_9f8 - fVar138;
    fStack_ad4 = fStack_9f4 - fVar145;
    fStack_ad0 = fStack_9f0 - fVar147;
    fStack_acc = fStack_9ec - fVar181;
    fVar166 = local_9a8 - local_9f8;
    fVar116 = fStack_9a4 - fStack_9f4;
    fStack_b70 = fStack_9a0 - fStack_9f0;
    fStack_b6c = fStack_99c - fStack_9ec;
    local_b78 = CONCAT44(fVar116,fVar166);
    local_b98 = CONCAT44(fVar189,fVar183);
    uStack_b90 = CONCAT44(fVar191,fVar190);
    fVar149 = (fVar183 * (local_9e8 + local_c38) - local_b88 * (local_9d8 + (float)local_ba8._0_4_))
              * local_c88._4_4_ +
              (local_b88 * (local_9f8 + fVar138) - (local_9e8 + local_c38) * local_ad8) *
              local_ca8._4_4_ +
              ((local_9d8 + (float)local_ba8._0_4_) * local_ad8 - (local_9f8 + fVar138) * fVar183) *
              local_c18._4_4_;
    fVar170 = (fVar189 * (fStack_9e4 + fStack_c34) -
              fStack_b84 * (fStack_9d4 + (float)local_ba8._4_4_)) * local_c88._4_4_ +
              (fStack_b84 * (fStack_9f4 + fVar145) - (fStack_9e4 + fStack_c34) * fStack_ad4) *
              local_ca8._4_4_ +
              ((fStack_9d4 + (float)local_ba8._4_4_) * fStack_ad4 - (fStack_9f4 + fVar145) * fVar189
              ) * local_c18._4_4_;
    local_ae8 = (undefined1  [8])CONCAT44(fVar170,fVar149);
    fStack_ae0 = (fVar190 * (fStack_9e0 + fStack_c30) - fStack_b80 * (fStack_9d0 + fStack_ba0)) *
                 local_c88._4_4_ +
                 (fStack_b80 * (fStack_9f0 + fVar147) - (fStack_9e0 + fStack_c30) * fStack_ad0) *
                 local_ca8._4_4_ +
                 ((fStack_9d0 + fStack_ba0) * fStack_ad0 - (fStack_9f0 + fVar147) * fVar190) *
                 local_c18._4_4_;
    fStack_adc = (fVar191 * (fStack_9dc + fStack_c2c) - fStack_b7c * (fStack_9cc + fStack_b9c)) *
                 local_c88._4_4_ +
                 (fStack_b7c * (fStack_9ec + fVar181) - (fStack_9dc + fStack_c2c) * fStack_acc) *
                 local_ca8._4_4_ +
                 ((fStack_9cc + fStack_b9c) * fStack_acc - (fStack_9ec + fVar181) * fVar191) *
                 local_c18._4_4_;
    fVar188 = (float)local_ba8._0_4_ - (float)local_c48._0_4_;
    fVar150 = (float)local_ba8._4_4_ - (float)local_c48._4_4_;
    fVar157 = fStack_ba0 - fStack_c40;
    fVar161 = fStack_b9c - fStack_c3c;
    fVar165 = local_c38 - local_b68;
    fVar124 = fStack_c34 - fStack_b64;
    fVar125 = fStack_c30 - fStack_b60;
    fVar134 = fStack_c2c - fStack_b5c;
    fVar117 = local_b68 + local_c38;
    fVar118 = fStack_b64 + fStack_c34;
    fVar132 = fStack_b60 + fStack_c30;
    fVar168 = fStack_b5c + fStack_c2c;
    fVar126 = fVar138 - local_9a8;
    fVar137 = fVar145 - fStack_9a4;
    fVar144 = fVar147 - fStack_9a0;
    fVar146 = fVar181 - fStack_99c;
    local_b68 = fVar138;
    fStack_b64 = fVar145;
    fStack_b60 = fVar147;
    fStack_b5c = fVar181;
    local_af8._0_4_ =
         (fVar188 * fVar117 - fVar165 * ((float)local_c48._0_4_ + (float)local_ba8._0_4_)) *
         local_c88._4_4_ +
         (fVar165 * (local_9a8 + fVar138) - fVar117 * fVar126) * local_ca8._4_4_ +
         (((float)local_c48._0_4_ + (float)local_ba8._0_4_) * fVar126 -
         (local_9a8 + fVar138) * fVar188) * local_c18._4_4_;
    local_af8._4_4_ =
         (fVar150 * fVar118 - fVar124 * ((float)local_c48._4_4_ + (float)local_ba8._4_4_)) *
         local_c88._4_4_ +
         (fVar124 * (fStack_9a4 + fVar145) - fVar118 * fVar137) * local_ca8._4_4_ +
         (((float)local_c48._4_4_ + (float)local_ba8._4_4_) * fVar137 -
         (fStack_9a4 + fVar145) * fVar150) * local_c18._4_4_;
    fStack_af0 = (fVar157 * fVar132 - fVar125 * (fStack_c40 + fStack_ba0)) * local_c88._4_4_ +
                 (fVar125 * (fStack_9a0 + fVar147) - fVar132 * fVar144) * local_ca8._4_4_ +
                 ((fStack_c40 + fStack_ba0) * fVar144 - (fStack_9a0 + fVar147) * fVar157) *
                 local_c18._4_4_;
    fStack_aec = (fVar161 * fVar168 - fVar134 * (fStack_c3c + fStack_b9c)) * local_c88._4_4_ +
                 (fVar134 * (fStack_99c + fVar181) - fVar168 * fVar146) * local_ca8._4_4_ +
                 ((fStack_c3c + fStack_b9c) * fVar146 - (fStack_99c + fVar181) * fVar161) *
                 local_c18._4_4_;
    local_c48._4_4_ = fVar127;
    local_c48._0_4_ = fVar73;
    fStack_c40 = fVar182;
    fStack_c3c = fVar148;
    auVar65._0_4_ =
         (fVar57 * local_9c8 - fVar73 * local_9b8) * local_c88._4_4_ +
         (fVar73 * local_a08 - local_9c8 * fVar166) * local_ca8._4_4_ +
         (local_9b8 * fVar166 - local_a08 * fVar57) * local_c18._4_4_;
    auVar65._4_4_ =
         (fVar115 * fStack_9c4 - fVar127 * fStack_9b4) * local_c88._4_4_ +
         (fVar127 * fStack_a04 - fStack_9c4 * fVar116) * local_ca8._4_4_ +
         (fStack_9b4 * fVar116 - fStack_a04 * fVar115) * local_c18._4_4_;
    auVar65._8_4_ =
         (fStack_c90 * fStack_9c0 - fVar182 * fStack_9b0) * local_c88._4_4_ +
         (fVar182 * fStack_a00 - fStack_9c0 * fStack_b70) * local_ca8._4_4_ +
         (fStack_9b0 * fStack_b70 - fStack_a00 * fStack_c90) * local_c18._4_4_;
    auVar65._12_4_ =
         (fStack_c8c * fStack_9bc - fVar148 * fStack_9ac) * local_c88._4_4_ +
         (fVar148 * fStack_9fc - fStack_9bc * fStack_b6c) * local_ca8._4_4_ +
         (fStack_9ac * fStack_b6c - fStack_9fc * fStack_c8c) * local_c18._4_4_;
    local_b08._0_4_ = fVar149 + (float)local_af8._0_4_ + auVar65._0_4_;
    local_b08._4_4_ = fVar170 + (float)local_af8._4_4_ + auVar65._4_4_;
    fStack_b00 = fStack_ae0 + fStack_af0 + auVar65._8_4_;
    fStack_afc = fStack_adc + fStack_aec + auVar65._12_4_;
    auVar81._8_4_ = fStack_ae0;
    auVar81._0_8_ = local_ae8;
    auVar81._12_4_ = fStack_adc;
    auVar185 = minps(auVar81,_local_af8);
    auVar185 = minps(auVar185,auVar65);
    auVar112._8_4_ = fStack_ae0;
    auVar112._0_8_ = local_ae8;
    auVar112._12_4_ = fStack_adc;
    auVar184 = maxps(auVar112,_local_af8);
    auVar184 = maxps(auVar184,auVar65);
    local_b18 = ABS((float)local_b08._0_4_);
    fStack_b14 = ABS((float)local_b08._4_4_);
    fStack_b10 = ABS(fStack_b00);
    fStack_b0c = ABS(fStack_afc);
    auVar113._4_4_ = -(uint)(auVar184._4_4_ <= fStack_b14 * 1.1920929e-07);
    auVar113._0_4_ = -(uint)(auVar184._0_4_ <= local_b18 * 1.1920929e-07);
    auVar113._8_4_ = -(uint)(auVar184._8_4_ <= fStack_b10 * 1.1920929e-07);
    auVar113._12_4_ = -(uint)(auVar184._12_4_ <= fStack_b0c * 1.1920929e-07);
    auVar82._4_4_ = -(uint)(-(fStack_b14 * 1.1920929e-07) <= auVar185._4_4_);
    auVar82._0_4_ = -(uint)(-(local_b18 * 1.1920929e-07) <= auVar185._0_4_);
    auVar82._8_4_ = -(uint)(-(fStack_b10 * 1.1920929e-07) <= auVar185._8_4_);
    auVar82._12_4_ = -(uint)(-(fStack_b0c * 1.1920929e-07) <= auVar185._12_4_);
    auVar113 = auVar113 | auVar82;
    auVar114._0_4_ = auVar113._0_4_ & local_908;
    auVar114._4_4_ = auVar113._4_4_ & uStack_904;
    auVar114._8_4_ = auVar113._8_4_ & uStack_900;
    auVar114._12_4_ = auVar113._12_4_ & uStack_8fc;
    iVar37 = movmskps(iVar37,auVar114);
    if (iVar37 != 0) {
      auVar187._0_4_ = fVar183 * fVar165 - local_b88 * fVar188;
      auVar187._4_4_ = fVar189 * fVar124 - fStack_b84 * fVar150;
      auVar187._8_4_ = fVar190 * fVar125 - fStack_b80 * fVar157;
      auVar187._12_4_ = fVar191 * fVar134 - fStack_b7c * fVar161;
      auVar156._0_4_ = fVar188 * fVar73 - fVar165 * fVar57;
      auVar156._4_4_ = fVar150 * fVar127 - fVar124 * fVar115;
      auVar156._8_4_ = fVar157 * fVar182 - fVar125 * fStack_c90;
      auVar156._12_4_ = fVar161 * fVar148 - fVar134 * fStack_c8c;
      auVar66._4_4_ = -(uint)(ABS(fStack_b84 * fVar150) < ABS(fVar124 * fVar115));
      auVar66._0_4_ = -(uint)(ABS(local_b88 * fVar188) < ABS(fVar165 * fVar57));
      auVar66._8_4_ = -(uint)(ABS(fStack_b80 * fVar157) < ABS(fVar125 * fStack_c90));
      auVar66._12_4_ = -(uint)(ABS(fStack_b7c * fVar161) < ABS(fVar134 * fStack_c8c));
      local_a38 = blendvps(auVar156,auVar187,auVar66);
      auVar142._0_4_ = local_b88 * fVar126 - local_ad8 * fVar165;
      auVar142._4_4_ = fStack_b84 * fVar137 - fStack_ad4 * fVar124;
      auVar142._8_4_ = fStack_b80 * fVar144 - fStack_ad0 * fVar125;
      auVar142._12_4_ = fStack_b7c * fVar146 - fStack_acc * fVar134;
      auVar178._0_4_ = fVar165 * fVar166 - fVar126 * fVar73;
      auVar178._4_4_ = fVar124 * fVar116 - fVar137 * fVar127;
      auVar178._8_4_ = fVar125 * fStack_b70 - fVar144 * fVar182;
      auVar178._12_4_ = fVar134 * fStack_b6c - fVar146 * fVar148;
      auVar67._4_4_ = -(uint)(ABS(fStack_ad4 * fVar124) < ABS(fVar137 * fVar127));
      auVar67._0_4_ = -(uint)(ABS(local_ad8 * fVar165) < ABS(fVar126 * fVar73));
      auVar67._8_4_ = -(uint)(ABS(fStack_ad0 * fVar125) < ABS(fVar144 * fVar182));
      auVar67._12_4_ = -(uint)(ABS(fStack_acc * fVar134) < ABS(fVar146 * fVar148));
      local_a28 = blendvps(auVar178,auVar142,auVar67);
      auVar174._0_4_ = local_ad8 * fVar188 - fVar183 * fVar126;
      auVar174._4_4_ = fStack_ad4 * fVar150 - fVar189 * fVar137;
      auVar174._8_4_ = fStack_ad0 * fVar157 - fVar190 * fVar144;
      auVar174._12_4_ = fStack_acc * fVar161 - fVar191 * fVar146;
      auVar176._0_4_ = fVar126 * fVar57 - fVar188 * fVar166;
      auVar176._4_4_ = fVar137 * fVar115 - fVar150 * fVar116;
      auVar176._8_4_ = fVar144 * fStack_c90 - fVar157 * fStack_b70;
      auVar176._12_4_ = fVar146 * fStack_c8c - fVar161 * fStack_b6c;
      auVar68._4_4_ = -(uint)(ABS(fVar189 * fVar137) < ABS(fVar150 * fVar116));
      auVar68._0_4_ = -(uint)(ABS(fVar183 * fVar126) < ABS(fVar188 * fVar166));
      auVar68._8_4_ = -(uint)(ABS(fVar190 * fVar144) < ABS(fVar157 * fStack_b70));
      auVar68._12_4_ = -(uint)(ABS(fVar191 * fVar146) < ABS(fVar161 * fStack_b6c));
      local_a18 = blendvps(auVar176,auVar174,auVar68);
      fVar57 = local_c88._4_4_ * local_a38._0_4_ +
               local_ca8._4_4_ * local_a28._0_4_ + local_c18._4_4_ * local_a18._0_4_;
      fVar166 = local_c88._4_4_ * local_a38._4_4_ +
                local_ca8._4_4_ * local_a28._4_4_ + local_c18._4_4_ * local_a18._4_4_;
      fVar115 = local_c88._4_4_ * local_a38._8_4_ +
                local_ca8._4_4_ * local_a28._8_4_ + local_c18._4_4_ * local_a18._8_4_;
      fVar116 = local_c88._4_4_ * local_a38._12_4_ +
                local_ca8._4_4_ * local_a28._12_4_ + local_c18._4_4_ * local_a18._12_4_;
      auVar179._0_4_ = fVar57 + fVar57;
      auVar179._4_4_ = fVar166 + fVar166;
      auVar179._8_4_ = fVar115 + fVar115;
      auVar179._12_4_ = fVar116 + fVar116;
      auVar83._0_4_ = local_c38 * local_a18._0_4_;
      auVar83._4_4_ = fStack_c34 * local_a18._4_4_;
      auVar83._8_4_ = fStack_c30 * local_a18._8_4_;
      auVar83._12_4_ = fStack_c2c * local_a18._12_4_;
      fVar117 = fVar138 * local_a38._0_4_ + (float)local_ba8._0_4_ * local_a28._0_4_ + auVar83._0_4_
      ;
      fVar118 = fVar145 * local_a38._4_4_ + (float)local_ba8._4_4_ * local_a28._4_4_ + auVar83._4_4_
      ;
      fVar132 = fVar147 * local_a38._8_4_ + fStack_ba0 * local_a28._8_4_ + auVar83._8_4_;
      fVar168 = fVar181 * local_a38._12_4_ + fStack_b9c * local_a28._12_4_ + auVar83._12_4_;
      auVar185 = rcpps(auVar83,auVar179);
      fVar57 = auVar185._0_4_;
      fVar166 = auVar185._4_4_;
      fVar115 = auVar185._8_4_;
      fVar116 = auVar185._12_4_;
      local_a48._0_4_ = ((1.0 - auVar179._0_4_ * fVar57) * fVar57 + fVar57) * (fVar117 + fVar117);
      local_a48._4_4_ = ((1.0 - auVar179._4_4_ * fVar166) * fVar166 + fVar166) * (fVar118 + fVar118)
      ;
      fStack_a40 = ((1.0 - auVar179._8_4_ * fVar115) * fVar115 + fVar115) * (fVar132 + fVar132);
      fStack_a3c = ((1.0 - auVar179._12_4_ * fVar116) * fVar116 + fVar116) * (fVar168 + fVar168);
      local_c48 = (undefined1  [8])(local_c60->intersector1).intersect;
      _fStack_c40 = (local_c60->intersector1).occluded;
      fVar166 = SUB84(local_c48,0);
      fVar57 = *(float *)((long)&local_c60->leafIntersector + 4);
      iVar53 = -(uint)(fVar57 <= (float)local_a48._4_4_);
      iVar54 = -(uint)(fVar57 <= fStack_a40);
      iVar55 = -(uint)(fVar57 <= fStack_a3c);
      auVar84._8_4_ = iVar54;
      auVar84._4_4_ = iVar53;
      auVar84._12_4_ = iVar55;
      auVar180._0_4_ =
           (int)((uint)(auVar179._0_4_ != 0.0 &&
                       ((float)local_a48._0_4_ <= fVar166 && fVar57 <= (float)local_a48._0_4_)) *
                -0x80000000) >> 0x1f;
      auVar180._4_4_ =
           (int)((uint)(auVar179._4_4_ != 0.0 &&
                       ((float)local_a48._4_4_ <= fVar166 && fVar57 <= (float)local_a48._4_4_)) *
                -0x80000000) >> 0x1f;
      auVar180._8_4_ =
           (int)((uint)(auVar179._8_4_ != 0.0 && (fStack_a40 <= fVar166 && fVar57 <= fStack_a40)) *
                -0x80000000) >> 0x1f;
      auVar180._12_4_ =
           (int)((uint)(auVar179._12_4_ != 0.0 && (fStack_a3c <= fVar166 && fVar57 <= fStack_a3c)) *
                -0x80000000) >> 0x1f;
      iVar37 = movmskps(iVar37,auVar180 & auVar114);
      if (iVar37 != 0) {
        uVar46 = extractps(_local_c48,1);
        local_a98 = _local_b08;
        local_a88 = &local_ca9;
        local_a78 = auVar180 & auVar114;
        auVar94._0_4_ = (float)local_b08._0_4_ - (float)local_af8._0_4_;
        auVar94._4_4_ = (float)local_b08._4_4_ - (float)local_af8._4_4_;
        auVar94._8_4_ = fStack_b00 - fStack_af0;
        auVar94._12_4_ = fStack_afc - fStack_aec;
        auVar84._0_4_ = (float)(int)(*(ushort *)(local_b48 + 8 + local_b50) - 1);
        auVar130._4_4_ = iVar53;
        auVar130._0_4_ = auVar84._0_4_;
        auVar130._8_4_ = iVar54;
        auVar130._12_4_ = iVar55;
        auVar185 = rcpss(auVar130,auVar84);
        auVar143._4_12_ = auVar142._4_12_;
        auVar143._0_4_ = (float)(int)(*(ushort *)(local_b48 + 10 + local_b50) - 1);
        fStack_aac = (2.0 - auVar84._0_4_ * auVar185._0_4_) * auVar185._0_4_;
        auVar131._4_4_ = auVar142._4_4_;
        auVar131._0_4_ = auVar143._0_4_;
        auVar131._8_4_ = auVar142._8_4_;
        auVar131._12_4_ = auVar142._12_4_;
        auVar185 = rcpss(auVar131,auVar143);
        fVar57 = (2.0 - auVar143._0_4_ * auVar185._0_4_) * auVar185._0_4_;
        local_ab8 = fStack_aac *
                    ((float)(int)local_b28._0_4_ * (float)local_b08._0_4_ +
                    ((float)local_b08._0_4_ - fVar149));
        fStack_ab4 = fStack_aac *
                     ((float)(local_b28._0_4_ + 1) * (float)local_b08._4_4_ +
                     ((float)local_b08._4_4_ - fVar170));
        fStack_ab0 = fStack_aac *
                     ((float)(local_b28._0_4_ + 1) * fStack_b00 + (fStack_b00 - fStack_ae0));
        fStack_aac = fStack_aac *
                     ((float)(int)local_b28._0_4_ * fStack_afc + (fStack_afc - fStack_adc));
        local_aa8._0_4_ =
             fVar57 * ((float)(int)local_b38._0_4_ * (float)local_b08._0_4_ + auVar94._0_4_);
        local_aa8._4_4_ =
             fVar57 * ((float)(int)local_b38._0_4_ * (float)local_b08._4_4_ + auVar94._4_4_);
        fStack_aa0 = fVar57 * ((float)(local_b38._0_4_ + 1) * fStack_b00 + auVar94._8_4_);
        fStack_a9c = fVar57 * ((float)(local_b38._0_4_ + 1) * fStack_afc + auVar94._12_4_);
        lVar39 = *(long *)(*(long *)(local_b40 + 0x1e8) + local_c20 * 8);
        if ((*(uint *)(lVar39 + 0x34) & (uint)uVar46) != 0) {
          pbVar48 = *(byte **)&(local_c28->dir).field_0;
          if ((*(long *)(pbVar48 + 0x10) == 0) && (*(long *)(lVar39 + 0x48) == 0)) {
LAB_006b7a56:
            *(undefined4 *)&(local_c60->intersector1).intersect = 0xff800000;
            return;
          }
          auVar185 = rcpps(auVar94,_local_b08);
          fVar57 = auVar185._0_4_;
          fVar166 = auVar185._4_4_;
          fVar115 = auVar185._8_4_;
          fVar116 = auVar185._12_4_;
          fVar57 = (float)(-(uint)(1e-18 <= local_b18) &
                          (uint)(((float)DAT_01f46a60 - (float)local_b08._0_4_ * fVar57) * fVar57 +
                                fVar57));
          fVar166 = (float)(-(uint)(1e-18 <= fStack_b14) &
                           (uint)((DAT_01f46a60._4_4_ - (float)local_b08._4_4_ * fVar166) * fVar166
                                 + fVar166));
          fVar115 = (float)(-(uint)(1e-18 <= fStack_b10) &
                           (uint)((DAT_01f46a60._8_4_ - fStack_b00 * fVar115) * fVar115 + fVar115));
          fVar116 = (float)(-(uint)(1e-18 <= fStack_b0c) &
                           (uint)((DAT_01f46a60._12_4_ - fStack_afc * fVar116) * fVar116 + fVar116))
          ;
          auVar69._0_4_ = local_ab8 * fVar57;
          auVar69._4_4_ = fStack_ab4 * fVar166;
          auVar69._8_4_ = fStack_ab0 * fVar115;
          auVar69._12_4_ = fStack_aac * fVar116;
          local_a68 = minps(auVar69,_DAT_01f46a60);
          auVar85._0_4_ = (float)local_aa8._0_4_ * fVar57;
          auVar85._4_4_ = (float)local_aa8._4_4_ * fVar166;
          auVar85._8_4_ = fStack_aa0 * fVar115;
          auVar85._12_4_ = fStack_a9c * fVar116;
          local_a58 = minps(auVar85,_DAT_01f46a60);
          local_ca8._0_1_ = (byte)iVar37;
          uVar41 = (ulong)(byte)local_ca8;
          uVar44 = 0;
          if (uVar41 != 0) {
            for (; ((byte)local_ca8 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          local_c18 = *(undefined4 **)((long)&(local_c28->org).field_0 + 8);
          local_c98 = SUB84(pbVar48,0);
          uStack_c94 = (undefined4)((ulong)pbVar48 >> 0x20);
          local_c38 = (float)lVar39;
          fStack_c34 = (float)((ulong)lVar39 >> 0x20);
          fStack_ca0 = local_ca8._4_4_;
          fStack_c9c = local_ca8._4_4_;
          fStack_c80 = local_c88._4_4_;
          fStack_c7c = local_c88._4_4_;
          fStack_c0c = fStack_c10;
          local_998 = fStack_98c;
          fStack_994 = fStack_98c;
          fStack_990 = fStack_98c;
          local_988 = fStack_97c;
          fStack_984 = fStack_97c;
          fStack_980 = fStack_97c;
          local_978 = fStack_96c;
          fStack_974 = fStack_96c;
          fStack_970 = fStack_96c;
          while (local_ca8 = (byte *)uVar44, uVar41 != 0) {
            local_bfc = *(undefined4 *)(local_a68 + (long)local_ca8 * 4);
            local_bf8 = *(undefined4 *)(local_a58 + (long)local_ca8 * 4);
            *(undefined4 *)&(local_c60->intersector1).intersect =
                 *(undefined4 *)(local_a48 + (long)local_ca8 * 4);
            local_c08 = *(undefined4 *)(local_a38 + (long)local_ca8 * 4);
            local_c04 = *(undefined4 *)(local_a28 + (long)local_ca8 * 4);
            local_c00 = *(undefined4 *)(local_a18 + (long)local_ca8 * 4);
            local_bf4 = (undefined4)local_b58;
            local_bf0 = (undefined4)local_c20;
            local_bec = *local_c18;
            local_be8 = local_c18[1];
            local_c74 = -1;
            local_bd8 = &local_c74;
            local_bd0 = *(undefined8 *)(lVar39 + 0x18);
            local_bc8 = local_c18;
            local_bb8 = &local_c08;
            local_bb0 = 1;
            local_c88 = uVar41;
            local_bc0 = local_c60;
            if (*(code **)(lVar39 + 0x48) == (code *)0x0) {
LAB_006b7845:
              if ((*(code **)(pbVar48 + 0x10) == (code *)0x0) ||
                 (((*pbVar48 & 2) == 0 &&
                  ((*(byte *)(CONCAT44(fStack_c34,local_c38) + 0x3e) & 0x40) == 0))))
              goto LAB_006b7a56;
              (**(code **)(pbVar48 + 0x10))(&local_bd8);
              pbVar48 = (byte *)CONCAT44(uStack_c94,local_c98);
              if (*local_bd8 != 0) goto LAB_006b7a56;
            }
            else {
              (**(code **)(lVar39 + 0x48))(&local_bd8);
              pbVar48 = (byte *)CONCAT44(uStack_c94,local_c98);
              if (*local_bd8 != 0) goto LAB_006b7845;
            }
            *(undefined4 *)&(local_c60->intersector1).intersect = local_c48._0_4_;
            uVar41 = local_c88 ^ 1L << ((ulong)local_ca8 & 0x3f);
            uVar44 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            lVar39 = CONCAT44(fStack_c34,local_c38);
          }
        }
      }
    }
    ray = local_c28;
    This = local_c60;
    puVar50 = local_c58;
    uVar44 = local_c68;
    auVar177 = local_858;
    fVar117 = local_878;
    fVar57 = fStack_874;
    fVar116 = fStack_870;
    fVar118 = fStack_86c;
    fVar115 = local_868;
    fVar181 = fStack_864;
    fVar183 = fStack_860;
    fVar189 = fStack_85c;
    fVar190 = fStack_880;
    fVar191 = fStack_87c;
  }
  local_c50 = local_c50 + 1;
  context = (RayQueryContext *)0x0;
  auVar184 = local_8f8;
  fVar132 = local_928;
  fVar168 = fStack_924;
  fVar73 = fStack_920;
  fVar127 = fStack_91c;
  fVar182 = local_938;
  fVar148 = fStack_934;
  fVar149 = fStack_930;
  fVar170 = fStack_92c;
  fVar188 = local_948;
  fVar150 = fStack_944;
  fVar157 = fStack_940;
  fVar161 = fStack_93c;
  fVar126 = local_918;
  fVar137 = fStack_914;
  fVar144 = fStack_910;
  fVar146 = fStack_90c;
  fVar134 = local_958;
  fVar165 = fStack_954;
  fVar124 = fStack_950;
  fVar125 = fStack_94c;
  fVar166 = local_968;
  fVar138 = fStack_964;
  fVar145 = fStack_960;
  fVar147 = fStack_95c;
  goto LAB_006b61fb;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }